

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::sse2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [12];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Primitive PVar20;
  int iVar21;
  Geometry *pGVar22;
  __int_type_conflict _Var23;
  long lVar24;
  undefined1 auVar25 [16];
  RTCFeatureFlags RVar26;
  undefined6 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  int iVar54;
  undefined4 uVar55;
  ulong uVar56;
  RTCFilterFunctionN p_Var57;
  RayHitK<4> *pRVar58;
  RTCIntersectArguments *pRVar59;
  int iVar61;
  RTCIntersectArguments *pRVar62;
  ulong uVar63;
  RTCIntersectArguments *pRVar64;
  Geometry *pGVar65;
  long lVar66;
  long lVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  short sVar76;
  undefined2 uVar112;
  float fVar77;
  float fVar78;
  float fVar113;
  float fVar115;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar114;
  float fVar116;
  undefined8 uVar117;
  float fVar118;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar119;
  float fVar120;
  float fVar154;
  float fVar156;
  vfloat4 v_2;
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar155;
  float fVar157;
  float fVar158;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar159;
  float fVar169;
  float fVar170;
  vfloat4 v;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar171;
  float fVar189;
  float fVar190;
  vfloat4 v_1;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar191;
  float fVar192;
  float fVar201;
  float fVar203;
  undefined1 auVar193 [16];
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar210;
  float fVar232;
  float fVar233;
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar234;
  float fVar238;
  float fVar239;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar240;
  float fVar248;
  float fVar249;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar250;
  float fVar252;
  float fVar253;
  undefined1 auVar251 [16];
  float fVar254;
  float fVar261;
  float fVar262;
  undefined1 auVar255 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar263;
  float fVar264;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar265 [16];
  undefined1 auVar268 [16];
  float fVar273;
  float fVar274;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar284;
  float fVar292;
  float fVar293;
  float fVar295;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar294;
  float fVar296;
  undefined1 auVar291 [16];
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar305;
  float fVar307;
  float fVar308;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar306;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar309;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_4> bhit;
  undefined1 local_518 [8];
  float fStack_510;
  undefined4 uStack_50c;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined4 uStack_4dc;
  float local_448;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  Precalculations *local_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  RTCFilterFunctionNArguments local_348;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 (*local_2a8) [16];
  RayHitK<4> *local_2a0;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  LinearSpace3fa *local_228;
  Primitive *local_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  uint local_1e8;
  int local_1e4;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  float local_188 [4];
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168 [4];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [12];
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar60;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 uVar111;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  
  PVar20 = prim[1];
  uVar56 = (ulong)(byte)PVar20;
  lVar24 = uVar56 * 0x25;
  pPVar7 = prim + lVar24 + 6;
  fVar170 = *(float *)(pPVar7 + 0xc);
  fVar171 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar170;
  fVar189 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar170;
  fVar190 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar170;
  fVar159 = *(float *)(ray + k * 4 + 0x40) * fVar170;
  fVar169 = *(float *)(ray + k * 4 + 0x50) * fVar170;
  fVar170 = *(float *)(ray + k * 4 + 0x60) * fVar170;
  uVar55 = *(undefined4 *)(prim + uVar56 * 4 + 6);
  uVar111 = (undefined1)((uint)uVar55 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar55 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar55));
  uVar111 = (undefined1)((uint)uVar55 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar27,sVar76);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar60;
  auVar79._12_2_ = uVar112;
  auVar79._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar161._12_4_ = auVar79._12_4_;
  auVar161._8_2_ = 0;
  auVar161._0_8_ = uVar60;
  auVar161._10_2_ = uVar112;
  auVar259._10_6_ = auVar161._10_6_;
  auVar259._8_2_ = uVar112;
  auVar259._0_8_ = uVar60;
  uVar112 = (undefined2)uVar27;
  auVar28._4_8_ = auVar259._8_8_;
  auVar28._2_2_ = uVar112;
  auVar28._0_2_ = uVar112;
  fVar297 = (float)((int)sVar76 >> 8);
  fVar305 = (float)(auVar28._0_4_ >> 0x18);
  fVar307 = (float)(auVar259._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar56 * 5 + 6);
  uVar111 = (undefined1)((uint)uVar55 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar55 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar55));
  uVar111 = (undefined1)((uint)uVar55 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar27,sVar76);
  auVar123._8_4_ = 0;
  auVar123._0_8_ = uVar60;
  auVar123._12_2_ = uVar112;
  auVar123._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar122._12_4_ = auVar123._12_4_;
  auVar122._8_2_ = 0;
  auVar122._0_8_ = uVar60;
  auVar122._10_2_ = uVar112;
  auVar121._10_6_ = auVar122._10_6_;
  auVar121._8_2_ = uVar112;
  auVar121._0_8_ = uVar60;
  uVar112 = (undefined2)uVar27;
  auVar29._4_8_ = auVar121._8_8_;
  auVar29._2_2_ = uVar112;
  auVar29._0_2_ = uVar112;
  fVar191 = (float)((int)sVar76 >> 8);
  fVar201 = (float)(auVar29._0_4_ >> 0x18);
  fVar203 = (float)(auVar121._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar56 * 6 + 6);
  uVar111 = (undefined1)((uint)uVar55 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar55 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar55));
  uVar111 = (undefined1)((uint)uVar55 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar27,sVar76);
  auVar126._8_4_ = 0;
  auVar126._0_8_ = uVar60;
  auVar126._12_2_ = uVar112;
  auVar126._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar125._12_4_ = auVar126._12_4_;
  auVar125._8_2_ = 0;
  auVar125._0_8_ = uVar60;
  auVar125._10_2_ = uVar112;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._8_2_ = uVar112;
  auVar124._0_8_ = uVar60;
  uVar112 = (undefined2)uVar27;
  auVar30._4_8_ = auVar124._8_8_;
  auVar30._2_2_ = uVar112;
  auVar30._0_2_ = uVar112;
  fVar234 = (float)((int)sVar76 >> 8);
  fVar238 = (float)(auVar30._0_4_ >> 0x18);
  fVar239 = (float)(auVar124._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar56 * 0xf + 6);
  uVar111 = (undefined1)((uint)uVar55 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar55 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar55));
  uVar111 = (undefined1)((uint)uVar55 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar27,sVar76);
  auVar129._8_4_ = 0;
  auVar129._0_8_ = uVar60;
  auVar129._12_2_ = uVar112;
  auVar129._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._8_2_ = 0;
  auVar128._0_8_ = uVar60;
  auVar128._10_2_ = uVar112;
  auVar127._10_6_ = auVar128._10_6_;
  auVar127._8_2_ = uVar112;
  auVar127._0_8_ = uVar60;
  uVar112 = (undefined2)uVar27;
  auVar31._4_8_ = auVar127._8_8_;
  auVar31._2_2_ = uVar112;
  auVar31._0_2_ = uVar112;
  fVar77 = (float)((int)sVar76 >> 8);
  fVar113 = (float)(auVar31._0_4_ >> 0x18);
  fVar115 = (float)(auVar127._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + 6);
  uVar111 = (undefined1)((uint)uVar55 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar55 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar55));
  uVar111 = (undefined1)((uint)uVar55 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar27,sVar76);
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar60;
  auVar213._12_2_ = uVar112;
  auVar213._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar60;
  auVar212._10_2_ = uVar112;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar112;
  auVar211._0_8_ = uVar60;
  uVar112 = (undefined2)uVar27;
  auVar32._4_8_ = auVar211._8_8_;
  auVar32._2_2_ = uVar112;
  auVar32._0_2_ = uVar112;
  fVar240 = (float)((int)sVar76 >> 8);
  fVar248 = (float)(auVar32._0_4_ >> 0x18);
  fVar249 = (float)(auVar211._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + uVar56 + 6);
  uVar111 = (undefined1)((uint)uVar55 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar55 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar55));
  uVar111 = (undefined1)((uint)uVar55 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar27,sVar76);
  auVar216._8_4_ = 0;
  auVar216._0_8_ = uVar60;
  auVar216._12_2_ = uVar112;
  auVar216._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar60;
  auVar215._10_2_ = uVar112;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._8_2_ = uVar112;
  auVar214._0_8_ = uVar60;
  uVar112 = (undefined2)uVar27;
  auVar33._4_8_ = auVar214._8_8_;
  auVar33._2_2_ = uVar112;
  auVar33._0_2_ = uVar112;
  fVar254 = (float)((int)sVar76 >> 8);
  fVar261 = (float)(auVar33._0_4_ >> 0x18);
  fVar262 = (float)(auVar214._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar56 * 0x1a + 6);
  uVar111 = (undefined1)((uint)uVar55 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar55 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar55));
  uVar111 = (undefined1)((uint)uVar55 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar27,sVar76);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar60;
  auVar219._12_2_ = uVar112;
  auVar219._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar60;
  auVar218._10_2_ = uVar112;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar112;
  auVar217._0_8_ = uVar60;
  uVar112 = (undefined2)uVar27;
  auVar34._4_8_ = auVar217._8_8_;
  auVar34._2_2_ = uVar112;
  auVar34._0_2_ = uVar112;
  fVar250 = (float)((int)sVar76 >> 8);
  fVar252 = (float)(auVar34._0_4_ >> 0x18);
  fVar253 = (float)(auVar217._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar56 * 0x1b + 6);
  uVar111 = (undefined1)((uint)uVar55 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar55 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar55));
  uVar111 = (undefined1)((uint)uVar55 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar27,sVar76);
  auVar222._8_4_ = 0;
  auVar222._0_8_ = uVar60;
  auVar222._12_2_ = uVar112;
  auVar222._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._8_2_ = 0;
  auVar221._0_8_ = uVar60;
  auVar221._10_2_ = uVar112;
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._8_2_ = uVar112;
  auVar220._0_8_ = uVar60;
  uVar112 = (undefined2)uVar27;
  auVar35._4_8_ = auVar220._8_8_;
  auVar35._2_2_ = uVar112;
  auVar35._0_2_ = uVar112;
  fVar263 = (float)((int)sVar76 >> 8);
  fVar269 = (float)(auVar35._0_4_ >> 0x18);
  fVar271 = (float)(auVar220._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar56 * 0x1c + 6);
  uVar111 = (undefined1)((uint)uVar55 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar55 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar55));
  uVar111 = (undefined1)((uint)uVar55 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar27,sVar76);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar60;
  auVar225._12_2_ = uVar112;
  auVar225._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._8_2_ = 0;
  auVar224._0_8_ = uVar60;
  auVar224._10_2_ = uVar112;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._8_2_ = uVar112;
  auVar223._0_8_ = uVar60;
  uVar112 = (undefined2)uVar27;
  auVar36._4_8_ = auVar223._8_8_;
  auVar36._2_2_ = uVar112;
  auVar36._0_2_ = uVar112;
  fVar119 = (float)((int)sVar76 >> 8);
  fVar154 = (float)(auVar36._0_4_ >> 0x18);
  fVar156 = (float)(auVar223._8_4_ >> 0x18);
  fVar284 = fVar159 * fVar297 + fVar169 * fVar191 + fVar170 * fVar234;
  fVar292 = fVar159 * fVar305 + fVar169 * fVar201 + fVar170 * fVar238;
  fVar293 = fVar159 * fVar307 + fVar169 * fVar203 + fVar170 * fVar239;
  fVar295 = fVar159 * (float)(auVar161._12_4_ >> 0x18) +
            fVar169 * (float)(auVar122._12_4_ >> 0x18) + fVar170 * (float)(auVar125._12_4_ >> 0x18);
  fVar274 = fVar159 * fVar77 + fVar169 * fVar240 + fVar170 * fVar254;
  fVar281 = fVar159 * fVar113 + fVar169 * fVar248 + fVar170 * fVar261;
  fVar282 = fVar159 * fVar115 + fVar169 * fVar249 + fVar170 * fVar262;
  fVar283 = fVar159 * (float)(auVar128._12_4_ >> 0x18) +
            fVar169 * (float)(auVar212._12_4_ >> 0x18) + fVar170 * (float)(auVar215._12_4_ >> 0x18);
  fVar210 = fVar159 * fVar250 + fVar169 * fVar263 + fVar170 * fVar119;
  fVar232 = fVar159 * fVar252 + fVar169 * fVar269 + fVar170 * fVar154;
  fVar233 = fVar159 * fVar253 + fVar169 * fVar271 + fVar170 * fVar156;
  fVar159 = fVar159 * (float)(auVar218._12_4_ >> 0x18) +
            fVar169 * (float)(auVar221._12_4_ >> 0x18) + fVar170 * (float)(auVar224._12_4_ >> 0x18);
  fVar298 = fVar297 * fVar171 + fVar191 * fVar189 + fVar234 * fVar190;
  fVar305 = fVar305 * fVar171 + fVar201 * fVar189 + fVar238 * fVar190;
  fVar307 = fVar307 * fVar171 + fVar203 * fVar189 + fVar239 * fVar190;
  fVar308 = (float)(auVar161._12_4_ >> 0x18) * fVar171 +
            (float)(auVar122._12_4_ >> 0x18) * fVar189 + (float)(auVar125._12_4_ >> 0x18) * fVar190;
  fVar254 = fVar77 * fVar171 + fVar240 * fVar189 + fVar254 * fVar190;
  fVar261 = fVar113 * fVar171 + fVar248 * fVar189 + fVar261 * fVar190;
  fVar262 = fVar115 * fVar171 + fVar249 * fVar189 + fVar262 * fVar190;
  fVar297 = (float)(auVar128._12_4_ >> 0x18) * fVar171 +
            (float)(auVar212._12_4_ >> 0x18) * fVar189 + (float)(auVar215._12_4_ >> 0x18) * fVar190;
  fVar250 = fVar171 * fVar250 + fVar189 * fVar263 + fVar190 * fVar119;
  fVar252 = fVar171 * fVar252 + fVar189 * fVar269 + fVar190 * fVar154;
  fVar253 = fVar171 * fVar253 + fVar189 * fVar271 + fVar190 * fVar156;
  fVar263 = fVar171 * (float)(auVar218._12_4_ >> 0x18) +
            fVar189 * (float)(auVar221._12_4_ >> 0x18) + fVar190 * (float)(auVar224._12_4_ >> 0x18);
  fVar170 = (float)DAT_01f80d30;
  fVar77 = DAT_01f80d30._4_4_;
  fVar113 = DAT_01f80d30._8_4_;
  fVar115 = DAT_01f80d30._12_4_;
  uVar68 = -(uint)(fVar170 <= ABS(fVar284));
  uVar69 = -(uint)(fVar77 <= ABS(fVar292));
  uVar71 = -(uint)(fVar113 <= ABS(fVar293));
  uVar73 = -(uint)(fVar115 <= ABS(fVar295));
  auVar285._0_4_ = (uint)fVar284 & uVar68;
  auVar285._4_4_ = (uint)fVar292 & uVar69;
  auVar285._8_4_ = (uint)fVar293 & uVar71;
  auVar285._12_4_ = (uint)fVar295 & uVar73;
  auVar172._0_4_ = ~uVar68 & (uint)fVar170;
  auVar172._4_4_ = ~uVar69 & (uint)fVar77;
  auVar172._8_4_ = ~uVar71 & (uint)fVar113;
  auVar172._12_4_ = ~uVar73 & (uint)fVar115;
  auVar172 = auVar172 | auVar285;
  uVar68 = -(uint)(fVar170 <= ABS(fVar274));
  uVar69 = -(uint)(fVar77 <= ABS(fVar281));
  uVar71 = -(uint)(fVar113 <= ABS(fVar282));
  uVar73 = -(uint)(fVar115 <= ABS(fVar283));
  auVar275._0_4_ = (uint)fVar274 & uVar68;
  auVar275._4_4_ = (uint)fVar281 & uVar69;
  auVar275._8_4_ = (uint)fVar282 & uVar71;
  auVar275._12_4_ = (uint)fVar283 & uVar73;
  auVar235._0_4_ = ~uVar68 & (uint)fVar170;
  auVar235._4_4_ = ~uVar69 & (uint)fVar77;
  auVar235._8_4_ = ~uVar71 & (uint)fVar113;
  auVar235._12_4_ = ~uVar73 & (uint)fVar115;
  auVar235 = auVar235 | auVar275;
  uVar68 = -(uint)(fVar170 <= ABS(fVar210));
  uVar69 = -(uint)(fVar77 <= ABS(fVar232));
  uVar71 = -(uint)(fVar113 <= ABS(fVar233));
  uVar73 = -(uint)(fVar115 <= ABS(fVar159));
  auVar226._0_4_ = (uint)fVar210 & uVar68;
  auVar226._4_4_ = (uint)fVar232 & uVar69;
  auVar226._8_4_ = (uint)fVar233 & uVar71;
  auVar226._12_4_ = (uint)fVar159 & uVar73;
  auVar241._0_4_ = ~uVar68 & (uint)fVar170;
  auVar241._4_4_ = ~uVar69 & (uint)fVar77;
  auVar241._8_4_ = ~uVar71 & (uint)fVar113;
  auVar241._12_4_ = ~uVar73 & (uint)fVar115;
  auVar241 = auVar241 | auVar226;
  auVar79 = rcpps(_DAT_01f80d30,auVar172);
  fVar170 = auVar79._0_4_;
  fVar115 = auVar79._4_4_;
  fVar191 = auVar79._8_4_;
  fVar240 = auVar79._12_4_;
  fVar170 = (1.0 - auVar172._0_4_ * fVar170) * fVar170 + fVar170;
  fVar115 = (1.0 - auVar172._4_4_ * fVar115) * fVar115 + fVar115;
  fVar191 = (1.0 - auVar172._8_4_ * fVar191) * fVar191 + fVar191;
  fVar240 = (1.0 - auVar172._12_4_ * fVar240) * fVar240 + fVar240;
  auVar79 = rcpps(auVar79,auVar235);
  fVar77 = auVar79._0_4_;
  fVar119 = auVar79._4_4_;
  fVar201 = auVar79._8_4_;
  fVar248 = auVar79._12_4_;
  fVar77 = (1.0 - auVar235._0_4_ * fVar77) * fVar77 + fVar77;
  fVar119 = (1.0 - auVar235._4_4_ * fVar119) * fVar119 + fVar119;
  fVar201 = (1.0 - auVar235._8_4_ * fVar201) * fVar201 + fVar201;
  fVar248 = (1.0 - auVar235._12_4_ * fVar248) * fVar248 + fVar248;
  auVar79 = rcpps(auVar79,auVar241);
  fVar113 = auVar79._0_4_;
  fVar154 = auVar79._4_4_;
  fVar203 = auVar79._8_4_;
  fVar249 = auVar79._12_4_;
  fVar113 = (1.0 - auVar241._0_4_ * fVar113) * fVar113 + fVar113;
  fVar154 = (1.0 - auVar241._4_4_ * fVar154) * fVar154 + fVar154;
  fVar203 = (1.0 - auVar241._8_4_ * fVar203) * fVar203 + fVar203;
  fVar249 = (1.0 - auVar241._12_4_ * fVar249) * fVar249 + fVar249;
  fVar269 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  uVar60 = *(ulong *)(prim + uVar56 * 7 + 6);
  uVar112 = (undefined2)(uVar60 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar60;
  auVar82._12_2_ = uVar112;
  auVar82._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar60 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar60;
  auVar81._10_2_ = uVar112;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar112;
  auVar80._0_8_ = uVar60;
  uVar112 = (undefined2)(uVar60 >> 0x10);
  auVar37._4_8_ = auVar80._8_8_;
  auVar37._2_2_ = uVar112;
  auVar37._0_2_ = uVar112;
  fVar156 = (float)(auVar37._0_4_ >> 0x10);
  fVar210 = (float)(auVar80._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar56 * 0xb + 6);
  uVar112 = (undefined2)(uVar9 >> 0x30);
  auVar175._8_4_ = 0;
  auVar175._0_8_ = uVar9;
  auVar175._12_2_ = uVar112;
  auVar175._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar9 >> 0x20);
  auVar174._12_4_ = auVar175._12_4_;
  auVar174._8_2_ = 0;
  auVar174._0_8_ = uVar9;
  auVar174._10_2_ = uVar112;
  auVar173._10_6_ = auVar174._10_6_;
  auVar173._8_2_ = uVar112;
  auVar173._0_8_ = uVar9;
  uVar112 = (undefined2)(uVar9 >> 0x10);
  auVar38._4_8_ = auVar173._8_8_;
  auVar38._2_2_ = uVar112;
  auVar38._0_2_ = uVar112;
  uVar10 = *(ulong *)(prim + uVar56 * 9 + 6);
  uVar112 = (undefined2)(uVar10 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar10;
  auVar85._12_2_ = uVar112;
  auVar85._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar10 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar10;
  auVar84._10_2_ = uVar112;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar112;
  auVar83._0_8_ = uVar10;
  uVar112 = (undefined2)(uVar10 >> 0x10);
  auVar39._4_8_ = auVar83._8_8_;
  auVar39._2_2_ = uVar112;
  auVar39._0_2_ = uVar112;
  fVar159 = (float)(auVar39._0_4_ >> 0x10);
  fVar232 = (float)(auVar83._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar56 * 0xd + 6);
  uVar112 = (undefined2)(uVar11 >> 0x30);
  auVar244._8_4_ = 0;
  auVar244._0_8_ = uVar11;
  auVar244._12_2_ = uVar112;
  auVar244._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar11 >> 0x20);
  auVar243._12_4_ = auVar244._12_4_;
  auVar243._8_2_ = 0;
  auVar243._0_8_ = uVar11;
  auVar243._10_2_ = uVar112;
  auVar242._10_6_ = auVar243._10_6_;
  auVar242._8_2_ = uVar112;
  auVar242._0_8_ = uVar11;
  uVar112 = (undefined2)(uVar11 >> 0x10);
  auVar40._4_8_ = auVar242._8_8_;
  auVar40._2_2_ = uVar112;
  auVar40._0_2_ = uVar112;
  uVar12 = *(ulong *)(prim + uVar56 * 0x12 + 6);
  uVar112 = (undefined2)(uVar12 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar12;
  auVar88._12_2_ = uVar112;
  auVar88._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar12 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar12;
  auVar87._10_2_ = uVar112;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar112;
  auVar86._0_8_ = uVar12;
  uVar112 = (undefined2)(uVar12 >> 0x10);
  auVar41._4_8_ = auVar86._8_8_;
  auVar41._2_2_ = uVar112;
  auVar41._0_2_ = uVar112;
  fVar169 = (float)(auVar41._0_4_ >> 0x10);
  fVar233 = (float)(auVar86._8_4_ >> 0x10);
  uVar63 = (ulong)(uint)((int)(uVar56 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar56 * 2 + uVar63 + 6);
  uVar112 = (undefined2)(uVar13 >> 0x30);
  auVar257._8_4_ = 0;
  auVar257._0_8_ = uVar13;
  auVar257._12_2_ = uVar112;
  auVar257._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar13 >> 0x20);
  auVar256._12_4_ = auVar257._12_4_;
  auVar256._8_2_ = 0;
  auVar256._0_8_ = uVar13;
  auVar256._10_2_ = uVar112;
  auVar255._10_6_ = auVar256._10_6_;
  auVar255._8_2_ = uVar112;
  auVar255._0_8_ = uVar13;
  uVar112 = (undefined2)(uVar13 >> 0x10);
  auVar42._4_8_ = auVar255._8_8_;
  auVar42._2_2_ = uVar112;
  auVar42._0_2_ = uVar112;
  uVar63 = *(ulong *)(prim + uVar63 + 6);
  uVar112 = (undefined2)(uVar63 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar63;
  auVar91._12_2_ = uVar112;
  auVar91._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar63 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar63;
  auVar90._10_2_ = uVar112;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar112;
  auVar89._0_8_ = uVar63;
  uVar112 = (undefined2)(uVar63 >> 0x10);
  auVar43._4_8_ = auVar89._8_8_;
  auVar43._2_2_ = uVar112;
  auVar43._0_2_ = uVar112;
  fVar171 = (float)(auVar43._0_4_ >> 0x10);
  fVar234 = (float)(auVar89._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar56 * 0x18 + 6);
  uVar112 = (undefined2)(uVar14 >> 0x30);
  auVar267._8_4_ = 0;
  auVar267._0_8_ = uVar14;
  auVar267._12_2_ = uVar112;
  auVar267._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar14 >> 0x20);
  auVar266._12_4_ = auVar267._12_4_;
  auVar266._8_2_ = 0;
  auVar266._0_8_ = uVar14;
  auVar266._10_2_ = uVar112;
  auVar265._10_6_ = auVar266._10_6_;
  auVar265._8_2_ = uVar112;
  auVar265._0_8_ = uVar14;
  uVar112 = (undefined2)(uVar14 >> 0x10);
  auVar44._4_8_ = auVar265._8_8_;
  auVar44._2_2_ = uVar112;
  auVar44._0_2_ = uVar112;
  uVar15 = *(ulong *)(prim + uVar56 * 0x1d + 6);
  uVar112 = (undefined2)(uVar15 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar15;
  auVar94._12_2_ = uVar112;
  auVar94._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar15 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar15;
  auVar93._10_2_ = uVar112;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar112;
  auVar92._0_8_ = uVar15;
  uVar112 = (undefined2)(uVar15 >> 0x10);
  auVar45._4_8_ = auVar92._8_8_;
  auVar45._2_2_ = uVar112;
  auVar45._0_2_ = uVar112;
  fVar189 = (float)(auVar45._0_4_ >> 0x10);
  fVar238 = (float)(auVar92._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar56 + (ulong)(byte)PVar20 * 0x20 + 6);
  uVar112 = (undefined2)(uVar16 >> 0x30);
  auVar278._8_4_ = 0;
  auVar278._0_8_ = uVar16;
  auVar278._12_2_ = uVar112;
  auVar278._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar16 >> 0x20);
  auVar277._12_4_ = auVar278._12_4_;
  auVar277._8_2_ = 0;
  auVar277._0_8_ = uVar16;
  auVar277._10_2_ = uVar112;
  auVar276._10_6_ = auVar277._10_6_;
  auVar276._8_2_ = uVar112;
  auVar276._0_8_ = uVar16;
  uVar112 = (undefined2)(uVar16 >> 0x10);
  auVar46._4_8_ = auVar276._8_8_;
  auVar46._2_2_ = uVar112;
  auVar46._0_2_ = uVar112;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar20 * 0x20 - uVar56) + 6);
  uVar112 = (undefined2)(uVar17 >> 0x30);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar17;
  auVar97._12_2_ = uVar112;
  auVar97._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar17 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar17;
  auVar96._10_2_ = uVar112;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar112;
  auVar95._0_8_ = uVar17;
  uVar112 = (undefined2)(uVar17 >> 0x10);
  auVar47._4_8_ = auVar95._8_8_;
  auVar47._2_2_ = uVar112;
  auVar47._0_2_ = uVar112;
  fVar190 = (float)(auVar47._0_4_ >> 0x10);
  fVar239 = (float)(auVar95._8_4_ >> 0x10);
  uVar56 = *(ulong *)(prim + uVar56 * 0x23 + 6);
  uVar112 = (undefined2)(uVar56 >> 0x30);
  auVar288._8_4_ = 0;
  auVar288._0_8_ = uVar56;
  auVar288._12_2_ = uVar112;
  auVar288._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar56 >> 0x20);
  auVar287._12_4_ = auVar288._12_4_;
  auVar287._8_2_ = 0;
  auVar287._0_8_ = uVar56;
  auVar287._10_2_ = uVar112;
  auVar286._10_6_ = auVar287._10_6_;
  auVar286._8_2_ = uVar112;
  auVar286._0_8_ = uVar56;
  uVar112 = (undefined2)(uVar56 >> 0x10);
  auVar48._4_8_ = auVar286._8_8_;
  auVar48._2_2_ = uVar112;
  auVar48._0_2_ = uVar112;
  auVar176._0_8_ =
       CONCAT44(((((float)(auVar38._0_4_ >> 0x10) - fVar156) * fVar269 + fVar156) - fVar305) *
                fVar115,((((float)(int)(short)uVar9 - (float)(int)(short)uVar60) * fVar269 +
                         (float)(int)(short)uVar60) - fVar298) * fVar170);
  auVar176._8_4_ =
       ((((float)(auVar173._8_4_ >> 0x10) - fVar210) * fVar269 + fVar210) - fVar307) * fVar191;
  auVar176._12_4_ =
       ((((float)(auVar174._12_4_ >> 0x10) - (float)(auVar81._12_4_ >> 0x10)) * fVar269 +
        (float)(auVar81._12_4_ >> 0x10)) - fVar308) * fVar240;
  auVar245._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar269 +
        (float)(int)(short)uVar10) - fVar298) * fVar170;
  auVar245._4_4_ =
       ((((float)(auVar40._0_4_ >> 0x10) - fVar159) * fVar269 + fVar159) - fVar305) * fVar115;
  auVar245._8_4_ =
       ((((float)(auVar242._8_4_ >> 0x10) - fVar232) * fVar269 + fVar232) - fVar307) * fVar191;
  auVar245._12_4_ =
       ((((float)(auVar243._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar269 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar308) * fVar240;
  auVar258._0_8_ =
       CONCAT44(((((float)(auVar42._0_4_ >> 0x10) - fVar169) * fVar269 + fVar169) - fVar261) *
                fVar119,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar269 +
                         (float)(int)(short)uVar12) - fVar254) * fVar77);
  auVar258._8_4_ =
       ((((float)(auVar255._8_4_ >> 0x10) - fVar233) * fVar269 + fVar233) - fVar262) * fVar201;
  auVar258._12_4_ =
       ((((float)(auVar256._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar269 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar297) * fVar248;
  auVar268._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar63) * fVar269 +
        (float)(int)(short)uVar63) - fVar254) * fVar77;
  auVar268._4_4_ =
       ((((float)(auVar44._0_4_ >> 0x10) - fVar171) * fVar269 + fVar171) - fVar261) * fVar119;
  auVar268._8_4_ =
       ((((float)(auVar265._8_4_ >> 0x10) - fVar234) * fVar269 + fVar234) - fVar262) * fVar201;
  auVar268._12_4_ =
       ((((float)(auVar266._12_4_ >> 0x10) - (float)(auVar90._12_4_ >> 0x10)) * fVar269 +
        (float)(auVar90._12_4_ >> 0x10)) - fVar297) * fVar248;
  uVar55 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar279._0_8_ =
       CONCAT44(((((float)(auVar46._0_4_ >> 0x10) - fVar189) * fVar269 + fVar189) - fVar252) *
                fVar154,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar269 +
                         (float)(int)(short)uVar15) - fVar250) * fVar113);
  auVar279._8_4_ =
       ((((float)(auVar276._8_4_ >> 0x10) - fVar238) * fVar269 + fVar238) - fVar253) * fVar203;
  auVar279._12_4_ =
       ((((float)(auVar277._12_4_ >> 0x10) - (float)(auVar93._12_4_ >> 0x10)) * fVar269 +
        (float)(auVar93._12_4_ >> 0x10)) - fVar263) * fVar249;
  auVar289._0_4_ =
       ((((float)(int)(short)uVar56 - (float)(int)(short)uVar17) * fVar269 +
        (float)(int)(short)uVar17) - fVar250) * fVar113;
  auVar289._4_4_ =
       ((((float)(auVar48._0_4_ >> 0x10) - fVar190) * fVar269 + fVar190) - fVar252) * fVar154;
  auVar289._8_4_ =
       ((((float)(auVar286._8_4_ >> 0x10) - fVar239) * fVar269 + fVar239) - fVar253) * fVar203;
  auVar289._12_4_ =
       ((((float)(auVar287._12_4_ >> 0x10) - (float)(auVar96._12_4_ >> 0x10)) * fVar269 +
        (float)(auVar96._12_4_ >> 0x10)) - fVar263) * fVar249;
  auVar160._8_4_ = auVar176._8_4_;
  auVar160._0_8_ = auVar176._0_8_;
  auVar160._12_4_ = auVar176._12_4_;
  auVar161 = minps(auVar160,auVar245);
  auVar130._8_4_ = auVar258._8_4_;
  auVar130._0_8_ = auVar258._0_8_;
  auVar130._12_4_ = auVar258._12_4_;
  auVar79 = minps(auVar130,auVar268);
  auVar161 = maxps(auVar161,auVar79);
  auVar131._8_4_ = auVar279._8_4_;
  auVar131._0_8_ = auVar279._0_8_;
  auVar131._12_4_ = auVar279._12_4_;
  auVar79 = minps(auVar131,auVar289);
  auVar98._4_4_ = uVar55;
  auVar98._0_4_ = uVar55;
  auVar98._8_4_ = uVar55;
  auVar98._12_4_ = uVar55;
  auVar79 = maxps(auVar79,auVar98);
  auVar79 = maxps(auVar161,auVar79);
  auVar161 = maxps(auVar176,auVar245);
  auVar259 = maxps(auVar258,auVar268);
  auVar161 = minps(auVar161,auVar259);
  local_48 = auVar79._0_4_ * 0.99999964;
  fStack_44 = auVar79._4_4_ * 0.99999964;
  fStack_40 = auVar79._8_4_ * 0.99999964;
  fStack_3c = auVar79._12_4_ * 0.99999964;
  auVar79 = maxps(auVar279,auVar289);
  uVar55 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar99._4_4_ = uVar55;
  auVar99._0_4_ = uVar55;
  auVar99._8_4_ = uVar55;
  auVar99._12_4_ = uVar55;
  auVar79 = minps(auVar79,auVar99);
  auVar79 = minps(auVar161,auVar79);
  uVar68 = (uint)(byte)PVar20;
  auVar132._0_4_ = -(uint)(uVar68 != 0 && local_48 <= auVar79._0_4_ * 1.0000004);
  auVar132._4_4_ = -(uint)(1 < uVar68 && fStack_44 <= auVar79._4_4_ * 1.0000004);
  auVar132._8_4_ = -(uint)(2 < uVar68 && fStack_40 <= auVar79._8_4_ * 1.0000004);
  auVar132._12_4_ = -(uint)(3 < uVar68 && fStack_3c <= auVar79._12_4_ * 1.0000004);
  uVar68 = movmskps(uVar68,auVar132);
  if (uVar68 != 0) {
    uVar68 = uVar68 & 0xff;
    local_228 = pre->ray_space + k;
    local_3b8 = mm_lookupmask_ps._0_8_;
    uStack_3b0 = mm_lookupmask_ps._8_8_;
    local_2a8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_3d0 = pre;
    local_2a0 = ray;
    local_220 = prim;
    do {
      lVar24 = 0;
      if (uVar68 != 0) {
        for (; (uVar68 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
        }
      }
      uVar69 = *(uint *)(local_220 + 2);
      pRVar64 = (RTCIntersectArguments *)(ulong)uVar69;
      uVar71 = *(uint *)(local_220 + lVar24 * 4 + 6);
      pGVar22 = (context->scene->geometries).items[(long)pRVar64].ptr;
      uVar60 = (ulong)*(uint *)(*(long *)&pGVar22->field_0x58 +
                               (ulong)uVar71 *
                               pGVar22[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar170 = pGVar22->fnumTimeSegments;
      fVar77 = (pGVar22->time_range).lower;
      fVar113 = ((*(float *)(ray + k * 4 + 0x70) - fVar77) / ((pGVar22->time_range).upper - fVar77))
                * fVar170;
      fVar77 = floorf(fVar113);
      fVar170 = fVar170 + -1.0;
      if (fVar170 <= fVar77) {
        fVar77 = fVar170;
      }
      fVar170 = 0.0;
      if (0.0 <= fVar77) {
        fVar170 = fVar77;
      }
      _Var23 = pGVar22[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      pGVar65 = (Geometry *)((long)(int)fVar170 * 0x38);
      lVar24 = *(long *)((long)&pGVar65->device + _Var23);
      lVar66 = *(long *)((long)&pGVar65->modCounter_ + _Var23);
      lVar67 = *(long *)((long)&pGVar65->occlusionFilterN + _Var23);
      pfVar1 = (float *)(lVar66 + uVar60 * lVar67);
      pfVar2 = (float *)(lVar66 + (uVar60 + 1) * lVar67);
      pfVar3 = (float *)(lVar66 + (uVar60 + 2) * lVar67);
      fVar113 = fVar113 - fVar170;
      fVar170 = 1.0 - fVar113;
      pfVar4 = (float *)(lVar66 + lVar67 * (uVar60 + 3));
      lVar66 = *(long *)((long)&(pGVar65->super_RefCount)._vptr_RefCount + _Var23);
      pfVar5 = (float *)(lVar66 + lVar24 * uVar60);
      pfVar6 = (float *)(lVar66 + lVar24 * (uVar60 + 1));
      local_388 = *pfVar5 * fVar170 + *pfVar1 * fVar113;
      fStack_384 = pfVar5[1] * fVar170 + pfVar1[1] * fVar113;
      fStack_380 = pfVar5[2] * fVar170 + pfVar1[2] * fVar113;
      fStack_37c = pfVar5[3] * fVar170 + pfVar1[3] * fVar113;
      local_398 = *pfVar6 * fVar170 + *pfVar2 * fVar113;
      fStack_394 = pfVar6[1] * fVar170 + pfVar2[1] * fVar113;
      fStack_390 = pfVar6[2] * fVar170 + pfVar2[2] * fVar113;
      fStack_38c = pfVar6[3] * fVar170 + pfVar2[3] * fVar113;
      pfVar1 = (float *)(lVar66 + lVar24 * (uVar60 + 2));
      local_3a8 = *pfVar1 * fVar170 + *pfVar3 * fVar113;
      fStack_3a4 = pfVar1[1] * fVar170 + pfVar3[1] * fVar113;
      fStack_3a0 = pfVar1[2] * fVar170 + pfVar3[2] * fVar113;
      fStack_39c = pfVar1[3] * fVar170 + pfVar3[3] * fVar113;
      pfVar1 = (float *)(lVar66 + lVar24 * (uVar60 + 3));
      local_378 = fVar170 * *pfVar1 + fVar113 * *pfVar4;
      fStack_374 = fVar170 * pfVar1[1] + fVar113 * pfVar4[1];
      fStack_370 = fVar170 * pfVar1[2] + fVar113 * pfVar4[2];
      fStack_36c = fVar170 * pfVar1[3] + fVar113 * pfVar4[3];
      iVar21 = (int)pGVar22[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar170 = *(float *)(ray + k * 4);
      fVar77 = *(float *)(ray + k * 4 + 0x10);
      fVar113 = *(float *)(ray + k * 4 + 0x20);
      fVar191 = local_388 - fVar170;
      fVar201 = fStack_384 - fVar77;
      fVar203 = fStack_380 - fVar113;
      fVar115 = (local_228->vx).field_0.m128[0];
      fVar119 = (local_228->vx).field_0.m128[1];
      fVar154 = (local_228->vx).field_0.m128[2];
      fVar156 = (local_228->vy).field_0.m128[0];
      fVar159 = (local_228->vy).field_0.m128[1];
      fVar169 = (local_228->vy).field_0.m128[2];
      fVar171 = (local_228->vz).field_0.m128[0];
      fVar189 = (local_228->vz).field_0.m128[1];
      fVar190 = (local_228->vz).field_0.m128[2];
      local_238 = fVar191 * fVar115 + fVar201 * fVar156 + fVar203 * fVar171;
      local_248 = fVar191 * fVar119 + fVar201 * fVar159 + fVar203 * fVar189;
      fVar191 = fVar191 * fVar154 + fVar201 * fVar169 + fVar203 * fVar190;
      fVar201 = local_398 - fVar170;
      fVar203 = fStack_394 - fVar77;
      fVar210 = fStack_390 - fVar113;
      fVar232 = fVar201 * fVar115 + fVar203 * fVar156 + fVar210 * fVar171;
      fVar233 = fVar201 * fVar119 + fVar203 * fVar159 + fVar210 * fVar189;
      local_2b8 = fVar201 * fVar154 + fVar203 * fVar169 + fVar210 * fVar190;
      fVar201 = local_3a8 - fVar170;
      fVar203 = fStack_3a4 - fVar77;
      fVar210 = fStack_3a0 - fVar113;
      fVar234 = fVar201 * fVar115 + fVar203 * fVar156 + fVar210 * fVar171;
      local_2c8 = fVar201 * fVar119 + fVar203 * fVar159 + fVar210 * fVar189;
      fVar201 = fVar201 * fVar154 + fVar203 * fVar169 + fVar210 * fVar190;
      fVar170 = local_378 - fVar170;
      fVar77 = fStack_374 - fVar77;
      fVar113 = fStack_370 - fVar113;
      fVar115 = fVar170 * fVar115 + fVar77 * fVar156 + fVar113 * fVar171;
      local_2d8 = fVar170 * fVar119 + fVar77 * fVar159 + fVar113 * fVar189;
      fVar77 = fVar170 * fVar154 + fVar77 * fVar169 + fVar113 * fVar190;
      auVar177._0_8_ = CONCAT44(local_248,local_238) & 0x7fffffff7fffffff;
      auVar177._8_4_ = ABS(fVar191);
      auVar177._12_4_ = ABS(fStack_37c);
      auVar193._0_8_ = CONCAT44(fVar233,fVar232) & 0x7fffffff7fffffff;
      auVar193._8_4_ = ABS(local_2b8);
      auVar193._12_4_ = ABS(fStack_38c);
      auVar79 = maxps(auVar177,auVar193);
      auVar227._0_8_ = CONCAT44(local_2c8,fVar234) & 0x7fffffff7fffffff;
      auVar227._8_4_ = ABS(fVar201);
      auVar227._12_4_ = ABS(fStack_39c);
      auVar133._0_8_ = CONCAT44(local_2d8,fVar115) & 0x7fffffff7fffffff;
      auVar133._8_4_ = ABS(fVar77);
      auVar133._12_4_ = ABS(fStack_36c);
      auVar161 = maxps(auVar227,auVar133);
      auVar79 = maxps(auVar79,auVar161);
      uVar117 = auVar79._8_8_;
      fVar170 = auVar79._4_4_;
      if (auVar79._4_4_ <= auVar79._0_4_) {
        fVar170 = auVar79._0_4_;
      }
      auVar178._8_8_ = uVar117;
      auVar178._0_8_ = uVar117;
      fVar113 = (float)iVar21;
      _local_298 = ZEXT416((uint)fVar113);
      if (auVar79._8_4_ <= fVar170) {
        auVar179._4_12_ = auVar178._4_12_;
        auVar179._0_4_ = fVar170;
        uVar117 = auVar179._0_8_;
      }
      local_368._4_4_ = -(uint)(1.0 < fVar113);
      local_368._0_4_ = -(uint)(0.0 < fVar113);
      fStack_360 = (float)-(uint)(2.0 < fVar113);
      fStack_35c = (float)-(uint)(3.0 < fVar113);
      iVar61 = iVar21 * 0x40;
      lVar24 = (long)iVar21 * 0x44;
      fVar119 = *(float *)(bspline_basis0 + lVar24 + 0x908);
      fVar154 = *(float *)(bspline_basis0 + lVar24 + 0x90c);
      fVar156 = *(float *)(bspline_basis0 + lVar24 + 0x910);
      fVar159 = *(float *)(bspline_basis0 + lVar24 + 0x914);
      fVar170 = *(float *)*(undefined1 (*) [12])(bspline_basis0 + lVar24 + 0xd8c);
      fVar169 = *(float *)(bspline_basis0 + lVar24 + 0xd90);
      fVar171 = *(float *)(bspline_basis0 + lVar24 + 0xd94);
      auVar28 = *(undefined1 (*) [12])(bspline_basis0 + lVar24 + 0xd8c);
      fVar189 = *(float *)(bspline_basis0 + lVar24 + 0xd98);
      fVar190 = *(float *)(bspline_basis0 + lVar24 + 0x484);
      fVar203 = *(float *)(bspline_basis0 + lVar24 + 0x488);
      fVar210 = *(float *)(bspline_basis0 + lVar24 + 0x48c);
      fVar238 = *(float *)(bspline_basis0 + lVar24 + 0x490);
      local_2f8 = *(float *)(bspline_basis0 + lVar24);
      fStack_2f4 = *(float *)(bspline_basis0 + lVar24 + 4);
      fStack_2f0 = *(float *)(bspline_basis0 + lVar24 + 8);
      fStack_2ec = *(float *)(bspline_basis0 + lVar24 + 0xc);
      local_2e8 = local_238 * local_2f8 + fVar232 * fVar190 + fVar234 * fVar119 + fVar115 * fVar170;
      fStack_2e4 = local_238 * fStack_2f4 +
                   fVar232 * fVar203 + fVar234 * fVar154 + fVar115 * fVar169;
      fStack_2e0 = local_238 * fStack_2f0 +
                   fVar232 * fVar210 + fVar234 * fVar156 + fVar115 * fVar171;
      fStack_2dc = local_238 * fStack_2ec +
                   fVar232 * fVar238 + fVar234 * fVar159 + fVar115 * fVar189;
      local_258 = local_248 * local_2f8 +
                  fVar233 * fVar190 + local_2c8 * fVar119 + local_2d8 * fVar170;
      fStack_254 = local_248 * fStack_2f4 +
                   fVar233 * fVar203 + local_2c8 * fVar154 + local_2d8 * fVar169;
      fStack_250 = local_248 * fStack_2f0 +
                   fVar233 * fVar210 + local_2c8 * fVar156 + local_2d8 * fVar171;
      fStack_24c = local_248 * fStack_2ec +
                   fVar233 * fVar238 + local_2c8 * fVar159 + local_2d8 * fVar189;
      local_358._0_4_ =
           fStack_37c * local_2f8 +
           fStack_38c * fVar190 + fStack_39c * fVar119 + fStack_36c * fVar170;
      local_358._4_4_ =
           fStack_37c * fStack_2f4 +
           fStack_38c * fVar203 + fStack_39c * fVar154 + fStack_36c * fVar169;
      fStack_350 = fStack_37c * fStack_2f0 +
                   fStack_38c * fVar210 + fStack_39c * fVar156 + fStack_36c * fVar171;
      fStack_34c = fStack_37c * fStack_2ec +
                   fStack_38c * fVar238 + fStack_39c * fVar159 + fStack_36c * fVar189;
      fVar169 = *(float *)(bspline_basis1 + lVar24 + 0xd8c);
      fVar171 = *(float *)(bspline_basis1 + lVar24 + 0xd90);
      fVar239 = *(float *)(bspline_basis1 + lVar24 + 0xd94);
      fVar240 = *(float *)(bspline_basis1 + lVar24 + 0xd98);
      fVar248 = *(float *)(bspline_basis1 + lVar24 + 0x908);
      fVar249 = *(float *)(bspline_basis1 + lVar24 + 0x90c);
      fVar254 = *(float *)(bspline_basis1 + lVar24 + 0x910);
      fVar261 = *(float *)(bspline_basis1 + lVar24 + 0x914);
      local_138 = fStack_36c;
      fStack_134 = fStack_36c;
      fStack_130 = fStack_36c;
      fStack_12c = fStack_36c;
      local_128 = fStack_39c;
      fStack_124 = fStack_39c;
      fStack_120 = fStack_39c;
      fStack_11c = fStack_39c;
      fVar262 = *(float *)(bspline_basis1 + lVar24 + 0x484);
      fVar297 = *(float *)(bspline_basis1 + lVar24 + 0x488);
      fVar250 = *(float *)(bspline_basis1 + lVar24 + 0x48c);
      fVar252 = *(float *)(bspline_basis1 + lVar24 + 0x490);
      local_148 = fStack_38c;
      fStack_144 = fStack_38c;
      fStack_140 = fStack_38c;
      fStack_13c = fStack_38c;
      fVar253 = *(float *)(bspline_basis1 + lVar24);
      fVar263 = *(float *)(bspline_basis1 + lVar24 + 4);
      fVar269 = *(float *)(bspline_basis1 + lVar24 + 8);
      fVar271 = *(float *)(bspline_basis1 + lVar24 + 0xc);
      fVar298 = local_238 * fVar253 + fVar232 * fVar262 + fVar234 * fVar248 + fVar115 * fVar169;
      fVar307 = local_238 * fVar263 + fVar232 * fVar297 + fVar234 * fVar249 + fVar115 * fVar171;
      fVar204 = local_238 * fVar269 + fVar232 * fVar250 + fVar234 * fVar254 + fVar115 * fVar239;
      fVar207 = local_238 * fVar271 + fVar232 * fVar252 + fVar234 * fVar261 + fVar115 * fVar240;
      fVar284 = local_248 * fVar253 + fVar233 * fVar262 + local_2c8 * fVar248 + local_2d8 * fVar169;
      fVar292 = local_248 * fVar263 + fVar233 * fVar297 + local_2c8 * fVar249 + local_2d8 * fVar171;
      fVar293 = local_248 * fVar269 + fVar233 * fVar250 + local_2c8 * fVar254 + local_2d8 * fVar239;
      fVar295 = local_248 * fVar271 + fVar233 * fVar252 + local_2c8 * fVar261 + local_2d8 * fVar240;
      local_158 = fStack_37c;
      fStack_154 = fStack_37c;
      fStack_150 = fStack_37c;
      fStack_14c = fStack_37c;
      auVar246._0_4_ =
           fStack_37c * fVar253 + fStack_38c * fVar262 + fStack_39c * fVar248 + fStack_36c * fVar169
      ;
      auVar246._4_4_ =
           fStack_37c * fVar263 + fStack_38c * fVar297 + fStack_39c * fVar249 + fStack_36c * fVar171
      ;
      auVar246._8_4_ =
           fStack_37c * fVar269 + fStack_38c * fVar250 + fStack_39c * fVar254 + fStack_36c * fVar239
      ;
      auVar246._12_4_ =
           fStack_37c * fVar271 + fStack_38c * fVar252 + fStack_39c * fVar261 + fStack_36c * fVar240
      ;
      fVar305 = fVar298 - local_2e8;
      fVar308 = fVar307 - fStack_2e4;
      fVar205 = fVar204 - fStack_2e0;
      fVar208 = fVar207 - fStack_2dc;
      fVar274 = fVar284 - local_258;
      fVar281 = fVar292 - fStack_254;
      fVar282 = fVar293 - fStack_250;
      fVar283 = fVar295 - fStack_24c;
      fVar170 = local_258 * fVar305 - local_2e8 * fVar274;
      fVar317 = fStack_254 * fVar308 - fStack_2e4 * fVar281;
      fVar319 = fStack_250 * fVar205 - fStack_2e0 * fVar282;
      fVar321 = fStack_24c * fVar208 - fStack_2dc * fVar283;
      auVar79 = maxps(_local_358,auVar246);
      bVar51 = fVar170 * fVar170 <=
               auVar79._0_4_ * auVar79._0_4_ * (fVar305 * fVar305 + fVar274 * fVar274) &&
               0.0 < fVar113;
      bVar52 = fVar317 * fVar317 <=
               auVar79._4_4_ * auVar79._4_4_ * (fVar308 * fVar308 + fVar281 * fVar281) &&
               1.0 < fVar113;
      bVar50 = fVar319 * fVar319 <=
               auVar79._8_4_ * auVar79._8_4_ * (fVar205 * fVar205 + fVar282 * fVar282) &&
               2.0 < fVar113;
      bVar49 = fVar321 * fVar321 <=
               auVar79._12_4_ * auVar79._12_4_ * (fVar208 * fVar208 + fVar283 * fVar283) &&
               3.0 < fVar113;
      local_448 = (float)uVar117;
      local_448 = local_448 * 4.7683716e-07;
      auVar25._4_4_ = -(uint)bVar52;
      auVar25._0_4_ = -(uint)bVar51;
      auVar25._8_4_ = -(uint)bVar50;
      auVar25._12_4_ = -(uint)bVar49;
      iVar54 = movmskps(iVar21,auVar25);
      fVar170 = *(float *)(ray + k * 4 + 0x30);
      _local_288 = ZEXT416((uint)fVar170);
      fStack_2d4 = local_2d8;
      fStack_2d0 = local_2d8;
      fStack_2cc = local_2d8;
      fStack_2c4 = local_2c8;
      fStack_2c0 = local_2c8;
      fStack_2bc = local_2c8;
      fStack_2b4 = local_2b8;
      fStack_2b0 = local_2b8;
      fStack_2ac = local_2b8;
      fStack_244 = local_248;
      fStack_240 = local_248;
      fStack_23c = local_248;
      fStack_234 = local_238;
      fStack_230 = local_238;
      fStack_22c = local_238;
      if (iVar54 != 0) {
        local_278._4_4_ = fVar281;
        local_278._0_4_ = fVar274;
        fStack_270 = fVar282;
        fStack_26c = fVar283;
        fVar78 = fVar169 * fVar77 + fVar248 * fVar201 + fVar262 * local_2b8 + fVar253 * fVar191;
        fVar114 = fVar171 * fVar77 + fVar249 * fVar201 + fVar297 * local_2b8 + fVar263 * fVar191;
        fVar116 = fVar239 * fVar77 + fVar254 * fVar201 + fVar250 * local_2b8 + fVar269 * fVar191;
        fVar118 = fVar240 * fVar77 + fVar261 * fVar201 + fVar252 * local_2b8 + fVar271 * fVar191;
        local_518._0_4_ = auVar28._0_4_;
        local_518._4_4_ = auVar28._4_4_;
        fStack_510 = auVar28._8_4_;
        fVar120 = (float)local_518._0_4_ * fVar77 + fVar119 * fVar201 + fVar190 * local_2b8 +
                  local_2f8 * fVar191;
        fVar155 = (float)local_518._4_4_ * fVar77 + fVar154 * fVar201 + fVar203 * local_2b8 +
                  fStack_2f4 * fVar191;
        fVar157 = fStack_510 * fVar77 + fVar156 * fVar201 + fVar210 * local_2b8 +
                  fStack_2f0 * fVar191;
        fVar158 = fVar189 * fVar77 + fVar159 * fVar201 + fVar238 * local_2b8 + fStack_2ec * fVar191;
        fVar119 = *(float *)(bspline_basis0 + lVar24 + 0x1210);
        fVar154 = *(float *)(bspline_basis0 + lVar24 + 0x1214);
        fVar156 = *(float *)(bspline_basis0 + lVar24 + 0x1218);
        fVar159 = *(float *)(bspline_basis0 + lVar24 + 0x121c);
        fVar169 = *(float *)(bspline_basis0 + lVar24 + 0x1694);
        fVar171 = *(float *)(bspline_basis0 + lVar24 + 0x1698);
        fVar189 = *(float *)(bspline_basis0 + lVar24 + 0x169c);
        fVar190 = *(float *)(bspline_basis0 + lVar24 + 0x16a0);
        fVar203 = *(float *)(bspline_basis0 + lVar24 + 0x1b18);
        fVar210 = *(float *)(bspline_basis0 + lVar24 + 0x1b1c);
        fVar238 = *(float *)(bspline_basis0 + lVar24 + 0x1b20);
        fVar239 = *(float *)(bspline_basis0 + lVar24 + 0x1b24);
        fVar240 = *(float *)(bspline_basis0 + lVar24 + 0x1f9c);
        fVar248 = *(float *)(bspline_basis0 + lVar24 + 0x1fa0);
        fVar249 = *(float *)(bspline_basis0 + lVar24 + 0x1fa4);
        fVar254 = *(float *)(bspline_basis0 + lVar24 + 0x1fa8);
        fVar264 = local_238 * fVar119 + fVar232 * fVar169 + fVar234 * fVar203 + fVar115 * fVar240;
        fVar270 = local_238 * fVar154 + fVar232 * fVar171 + fVar234 * fVar210 + fVar115 * fVar248;
        fVar272 = local_238 * fVar156 + fVar232 * fVar189 + fVar234 * fVar238 + fVar115 * fVar249;
        fVar273 = local_238 * fVar159 + fVar232 * fVar190 + fVar234 * fVar239 + fVar115 * fVar254;
        fVar316 = local_248 * fVar119 +
                  fVar233 * fVar169 + local_2c8 * fVar203 + local_2d8 * fVar240;
        fVar318 = local_248 * fVar154 +
                  fVar233 * fVar171 + local_2c8 * fVar210 + local_2d8 * fVar248;
        fVar320 = local_248 * fVar156 +
                  fVar233 * fVar189 + local_2c8 * fVar238 + local_2d8 * fVar249;
        fVar322 = local_248 * fVar159 +
                  fVar233 * fVar190 + local_2c8 * fVar239 + local_2d8 * fVar254;
        fVar261 = *(float *)(bspline_basis1 + lVar24 + 0x1210);
        fVar262 = *(float *)(bspline_basis1 + lVar24 + 0x1214);
        fVar297 = *(float *)(bspline_basis1 + lVar24 + 0x1218);
        fVar250 = *(float *)(bspline_basis1 + lVar24 + 0x121c);
        fVar252 = *(float *)(bspline_basis1 + lVar24 + 0x1b18);
        fVar253 = *(float *)(bspline_basis1 + lVar24 + 0x1b1c);
        fVar263 = *(float *)(bspline_basis1 + lVar24 + 0x1b20);
        fVar269 = *(float *)(bspline_basis1 + lVar24 + 0x1b24);
        fVar271 = *(float *)(bspline_basis1 + lVar24 + 0x1f9c);
        fVar317 = *(float *)(bspline_basis1 + lVar24 + 0x1fa0);
        fVar319 = *(float *)(bspline_basis1 + lVar24 + 0x1fa4);
        fVar321 = *(float *)(bspline_basis1 + lVar24 + 0x1fa8);
        fVar294 = *(float *)(bspline_basis1 + lVar24 + 0x1694);
        fVar296 = *(float *)(bspline_basis1 + lVar24 + 0x1698);
        fVar299 = *(float *)(bspline_basis1 + lVar24 + 0x169c);
        fVar306 = *(float *)(bspline_basis1 + lVar24 + 0x16a0);
        fVar309 = local_238 * fVar261 + fVar232 * fVar294 + fVar234 * fVar252 + fVar115 * fVar271;
        fVar313 = local_238 * fVar262 + fVar232 * fVar296 + fVar234 * fVar253 + fVar115 * fVar317;
        fVar314 = local_238 * fVar297 + fVar232 * fVar299 + fVar234 * fVar263 + fVar115 * fVar319;
        fVar315 = local_238 * fVar250 + fVar232 * fVar306 + fVar234 * fVar269 + fVar115 * fVar321;
        fVar192 = local_248 * fVar261 +
                  fVar233 * fVar294 + local_2c8 * fVar252 + local_2d8 * fVar271;
        fVar202 = local_248 * fVar262 +
                  fVar233 * fVar296 + local_2c8 * fVar253 + local_2d8 * fVar317;
        fVar206 = local_248 * fVar297 +
                  fVar233 * fVar299 + local_2c8 * fVar263 + local_2d8 * fVar319;
        fVar209 = local_248 * fVar250 +
                  fVar233 * fVar306 + local_2c8 * fVar269 + local_2d8 * fVar321;
        auVar290._0_8_ = CONCAT44(fVar270,fVar264) & 0x7fffffff7fffffff;
        auVar290._8_4_ = ABS(fVar272);
        auVar290._12_4_ = ABS(fVar273);
        auVar251._0_8_ = CONCAT44(fVar318,fVar316) & 0x7fffffff7fffffff;
        auVar251._8_4_ = ABS(fVar320);
        auVar251._12_4_ = ABS(fVar322);
        auVar79 = maxps(auVar290,auVar251);
        auVar300._0_8_ =
             CONCAT44(fVar154 * fVar191 + fVar171 * local_2b8 + fVar210 * fVar201 + fVar248 * fVar77
                      ,fVar119 * fVar191 +
                       fVar169 * local_2b8 + fVar203 * fVar201 + fVar240 * fVar77) &
             0x7fffffff7fffffff;
        auVar300._8_4_ =
             ABS(fVar156 * fVar191 + fVar189 * local_2b8 + fVar238 * fVar201 + fVar249 * fVar77);
        auVar300._12_4_ =
             ABS(fVar159 * fVar191 + fVar190 * local_2b8 + fVar239 * fVar201 + fVar254 * fVar77);
        auVar79 = maxps(auVar79,auVar300);
        uVar73 = -(uint)(local_448 <= auVar79._0_4_);
        uVar70 = -(uint)(local_448 <= auVar79._4_4_);
        uVar72 = -(uint)(local_448 <= auVar79._8_4_);
        uVar74 = -(uint)(local_448 <= auVar79._12_4_);
        fVar169 = (float)((uint)fVar264 & uVar73 | ~uVar73 & (uint)fVar305);
        fVar189 = (float)((uint)fVar270 & uVar70 | ~uVar70 & (uint)fVar308);
        fVar238 = (float)((uint)fVar272 & uVar72 | ~uVar72 & (uint)fVar205);
        fVar239 = (float)((uint)fVar273 & uVar74 | ~uVar74 & (uint)fVar208);
        fVar240 = (float)(~uVar73 & (uint)fVar274 | (uint)fVar316 & uVar73);
        fVar248 = (float)(~uVar70 & (uint)fVar281 | (uint)fVar318 & uVar70);
        fVar249 = (float)(~uVar72 & (uint)fVar282 | (uint)fVar320 & uVar72);
        fVar254 = (float)(~uVar74 & (uint)fVar283 | (uint)fVar322 & uVar74);
        auVar301._0_8_ = CONCAT44(fVar313,fVar309) & 0x7fffffff7fffffff;
        auVar301._8_4_ = ABS(fVar314);
        auVar301._12_4_ = ABS(fVar315);
        auVar260._0_8_ = CONCAT44(fVar202,fVar192) & 0x7fffffff7fffffff;
        auVar260._8_4_ = ABS(fVar206);
        auVar260._12_4_ = ABS(fVar209);
        auVar79 = maxps(auVar301,auVar260);
        auVar236._0_8_ =
             CONCAT44(fVar262 * fVar191 + fVar296 * local_2b8 + fVar253 * fVar201 + fVar317 * fVar77
                      ,fVar261 * fVar191 +
                       fVar294 * local_2b8 + fVar252 * fVar201 + fVar271 * fVar77) &
             0x7fffffff7fffffff;
        auVar236._8_4_ =
             ABS(fVar297 * fVar191 + fVar299 * local_2b8 + fVar263 * fVar201 + fVar319 * fVar77);
        auVar236._12_4_ =
             ABS(fVar250 * fVar191 + fVar306 * local_2b8 + fVar269 * fVar201 + fVar321 * fVar77);
        auVar79 = maxps(auVar79,auVar236);
        uVar73 = -(uint)(local_448 <= auVar79._0_4_);
        uVar70 = -(uint)(local_448 <= auVar79._4_4_);
        uVar72 = -(uint)(local_448 <= auVar79._8_4_);
        uVar74 = -(uint)(local_448 <= auVar79._12_4_);
        fVar263 = (float)((uint)fVar309 & uVar73 | ~uVar73 & (uint)fVar305);
        fVar269 = (float)((uint)fVar313 & uVar70 | ~uVar70 & (uint)fVar308);
        fVar271 = (float)((uint)fVar314 & uVar72 | ~uVar72 & (uint)fVar205);
        fVar208 = (float)((uint)fVar315 & uVar74 | ~uVar74 & (uint)fVar208);
        auVar194._0_4_ = (uint)fVar192 & uVar73;
        auVar194._4_4_ = (uint)fVar202 & uVar70;
        auVar194._8_4_ = (uint)fVar206 & uVar72;
        auVar194._12_4_ = (uint)fVar209 & uVar74;
        auVar302._0_4_ = ~uVar73 & (uint)fVar274;
        auVar302._4_4_ = ~uVar70 & (uint)fVar281;
        auVar302._8_4_ = ~uVar72 & (uint)fVar282;
        auVar302._12_4_ = ~uVar74 & (uint)fVar283;
        auVar302 = auVar302 | auVar194;
        auVar134._0_4_ = fVar240 * fVar240 + fVar169 * fVar169;
        auVar134._4_4_ = fVar248 * fVar248 + fVar189 * fVar189;
        auVar134._8_4_ = fVar249 * fVar249 + fVar238 * fVar238;
        auVar134._12_4_ = fVar254 * fVar254 + fVar239 * fVar239;
        auVar79 = rsqrtps(auVar194,auVar134);
        fVar119 = auVar79._0_4_;
        fVar154 = auVar79._4_4_;
        fVar156 = auVar79._8_4_;
        fVar159 = auVar79._12_4_;
        auVar195._0_4_ = fVar119 * fVar119 * auVar134._0_4_ * 0.5 * fVar119;
        auVar195._4_4_ = fVar154 * fVar154 * auVar134._4_4_ * 0.5 * fVar154;
        auVar195._8_4_ = fVar156 * fVar156 * auVar134._8_4_ * 0.5 * fVar156;
        auVar195._12_4_ = fVar159 * fVar159 * auVar134._12_4_ * 0.5 * fVar159;
        fVar274 = fVar119 * 1.5 - auVar195._0_4_;
        fVar281 = fVar154 * 1.5 - auVar195._4_4_;
        fVar282 = fVar156 * 1.5 - auVar195._8_4_;
        fVar283 = fVar159 * 1.5 - auVar195._12_4_;
        fVar261 = auVar302._0_4_;
        fVar297 = auVar302._4_4_;
        fVar252 = auVar302._8_4_;
        fVar253 = auVar302._12_4_;
        auVar135._0_4_ = fVar261 * fVar261 + fVar263 * fVar263;
        auVar135._4_4_ = fVar297 * fVar297 + fVar269 * fVar269;
        auVar135._8_4_ = fVar252 * fVar252 + fVar271 * fVar271;
        auVar135._12_4_ = fVar253 * fVar253 + fVar208 * fVar208;
        auVar79 = rsqrtps(auVar195,auVar135);
        fVar119 = auVar79._0_4_;
        fVar154 = auVar79._4_4_;
        fVar156 = auVar79._8_4_;
        fVar159 = auVar79._12_4_;
        fVar171 = fVar119 * 1.5 - fVar119 * fVar119 * auVar135._0_4_ * 0.5 * fVar119;
        fVar190 = fVar154 * 1.5 - fVar154 * fVar154 * auVar135._4_4_ * 0.5 * fVar154;
        fVar203 = fVar156 * 1.5 - fVar156 * fVar156 * auVar135._8_4_ * 0.5 * fVar156;
        fVar210 = fVar159 * 1.5 - fVar159 * fVar159 * auVar135._12_4_ * 0.5 * fVar159;
        fVar262 = fVar240 * fVar274 * (float)local_358._0_4_;
        fVar250 = fVar248 * fVar281 * (float)local_358._4_4_;
        fVar294 = fVar249 * fVar282 * fStack_350;
        fVar296 = fVar254 * fVar283 * fStack_34c;
        fVar119 = -fVar169 * fVar274 * (float)local_358._0_4_;
        fVar156 = -fVar189 * fVar281 * (float)local_358._4_4_;
        fVar169 = -fVar238 * fVar282 * fStack_350;
        fVar189 = -fVar239 * fVar283 * fStack_34c;
        local_2f8 = local_258 + fVar119;
        fStack_2f4 = fStack_254 + fVar156;
        fStack_2f0 = fStack_250 + fVar169;
        fStack_2ec = fStack_24c + fVar189;
        fVar209 = fVar274 * 0.0 * (float)local_358._0_4_;
        fVar264 = fVar281 * 0.0 * (float)local_358._4_4_;
        fVar270 = fVar282 * 0.0 * fStack_350;
        fVar272 = fVar283 * 0.0 * fStack_34c;
        fVar299 = fVar261 * fVar171 * auVar246._0_4_;
        fVar306 = fVar297 * fVar190 * auVar246._4_4_;
        fVar192 = fVar252 * fVar203 * auVar246._8_4_;
        fVar202 = fVar253 * fVar210 * auVar246._12_4_;
        fVar283 = fVar298 + fVar299;
        fVar305 = fVar307 + fVar306;
        fVar308 = fVar204 + fVar192;
        fVar205 = fVar207 + fVar202;
        fVar238 = -fVar263 * fVar171 * auVar246._0_4_;
        fVar239 = -fVar269 * fVar190 * auVar246._4_4_;
        fVar248 = -fVar271 * fVar203 * auVar246._8_4_;
        fVar254 = -fVar208 * fVar210 * auVar246._12_4_;
        fVar271 = fVar284 + fVar238;
        fVar274 = fVar292 + fVar239;
        fVar281 = fVar293 + fVar248;
        fVar282 = fVar295 + fVar254;
        fVar154 = fVar171 * 0.0 * auVar246._0_4_;
        fVar159 = fVar190 * 0.0 * auVar246._4_4_;
        fVar171 = fVar203 * 0.0 * auVar246._8_4_;
        fVar190 = fVar210 * 0.0 * auVar246._12_4_;
        fVar240 = local_2e8 - fVar262;
        fVar249 = fStack_2e4 - fVar250;
        fVar261 = fStack_2e0 - fVar294;
        fVar297 = fStack_2dc - fVar296;
        fVar208 = fVar78 + fVar154;
        fVar317 = fVar114 + fVar159;
        fVar319 = fVar116 + fVar171;
        fVar321 = fVar118 + fVar190;
        fVar119 = local_258 - fVar119;
        fVar156 = fStack_254 - fVar156;
        fVar169 = fStack_250 - fVar169;
        fVar189 = fStack_24c - fVar189;
        fVar252 = fVar120 - fVar209;
        fVar253 = fVar155 - fVar264;
        fVar263 = fVar157 - fVar270;
        fVar269 = fVar158 - fVar272;
        uVar73 = -(uint)(0.0 < (fVar119 * (fVar208 - fVar252) - fVar252 * (fVar271 - fVar119)) * 0.0
                               + (fVar252 * (fVar283 - fVar240) - (fVar208 - fVar252) * fVar240) *
                                 0.0 + ((fVar271 - fVar119) * fVar240 -
                                       (fVar283 - fVar240) * fVar119));
        uVar70 = -(uint)(0.0 < (fVar156 * (fVar317 - fVar253) - fVar253 * (fVar274 - fVar156)) * 0.0
                               + (fVar253 * (fVar305 - fVar249) - (fVar317 - fVar253) * fVar249) *
                                 0.0 + ((fVar274 - fVar156) * fVar249 -
                                       (fVar305 - fVar249) * fVar156));
        uVar72 = -(uint)(0.0 < (fVar169 * (fVar319 - fVar263) - fVar263 * (fVar281 - fVar169)) * 0.0
                               + (fVar263 * (fVar308 - fVar261) - (fVar319 - fVar263) * fVar261) *
                                 0.0 + ((fVar281 - fVar169) * fVar261 -
                                       (fVar308 - fVar261) * fVar169));
        uVar74 = -(uint)(0.0 < (fVar189 * (fVar321 - fVar269) - fVar269 * (fVar282 - fVar189)) * 0.0
                               + (fVar269 * (fVar205 - fVar297) - (fVar321 - fVar269) * fVar297) *
                                 0.0 + ((fVar282 - fVar189) * fVar297 -
                                       (fVar205 - fVar297) * fVar189));
        fVar206 = (float)((uint)(fVar298 - fVar299) & uVar73 | ~uVar73 & (uint)(local_2e8 + fVar262)
                         );
        fVar306 = (float)((uint)(fVar307 - fVar306) & uVar70 |
                         ~uVar70 & (uint)(fStack_2e4 + fVar250));
        fVar192 = (float)((uint)(fVar204 - fVar192) & uVar72 |
                         ~uVar72 & (uint)(fStack_2e0 + fVar294));
        fVar202 = (float)((uint)(fVar207 - fVar202) & uVar74 |
                         ~uVar74 & (uint)(fStack_2dc + fVar296));
        fVar298 = (float)((uint)(fVar284 - fVar238) & uVar73 | ~uVar73 & (uint)local_2f8);
        fVar307 = (float)((uint)(fVar292 - fVar239) & uVar70 | ~uVar70 & (uint)fStack_2f4);
        fVar204 = (float)((uint)(fVar293 - fVar248) & uVar72 | ~uVar72 & (uint)fStack_2f0);
        fVar295 = (float)((uint)(fVar295 - fVar254) & uVar74 | ~uVar74 & (uint)fStack_2ec);
        fVar203 = (float)((uint)(fVar78 - fVar154) & uVar73 | ~uVar73 & (uint)(fVar120 + fVar209));
        fVar210 = (float)((uint)(fVar114 - fVar159) & uVar70 | ~uVar70 & (uint)(fVar155 + fVar264));
        fVar238 = (float)((uint)(fVar116 - fVar171) & uVar72 | ~uVar72 & (uint)(fVar157 + fVar270));
        fVar239 = (float)((uint)(fVar118 - fVar190) & uVar74 | ~uVar74 & (uint)(fVar158 + fVar272));
        fVar248 = (float)((uint)fVar240 & uVar73 | ~uVar73 & (uint)fVar283);
        fVar254 = (float)((uint)fVar249 & uVar70 | ~uVar70 & (uint)fVar305);
        fVar262 = (float)((uint)fVar261 & uVar72 | ~uVar72 & (uint)fVar308);
        fVar250 = (float)((uint)fVar297 & uVar74 | ~uVar74 & (uint)fVar205);
        fVar154 = (float)((uint)fVar119 & uVar73 | ~uVar73 & (uint)fVar271);
        fVar159 = (float)((uint)fVar156 & uVar70 | ~uVar70 & (uint)fVar274);
        fVar171 = (float)((uint)fVar169 & uVar72 | ~uVar72 & (uint)fVar281);
        fVar190 = (float)((uint)fVar189 & uVar74 | ~uVar74 & (uint)fVar282);
        fVar207 = (float)((uint)fVar252 & uVar73 | ~uVar73 & (uint)fVar208);
        fVar294 = (float)((uint)fVar253 & uVar70 | ~uVar70 & (uint)fVar317);
        fVar296 = (float)((uint)fVar263 & uVar72 | ~uVar72 & (uint)fVar319);
        fVar299 = (float)((uint)fVar269 & uVar74 | ~uVar74 & (uint)fVar321);
        fVar283 = (float)((uint)fVar283 & uVar73 | ~uVar73 & (uint)fVar240) - fVar206;
        fVar284 = (float)((uint)fVar305 & uVar70 | ~uVar70 & (uint)fVar249) - fVar306;
        fVar292 = (float)((uint)fVar308 & uVar72 | ~uVar72 & (uint)fVar261) - fVar192;
        fVar293 = (float)((uint)fVar205 & uVar74 | ~uVar74 & (uint)fVar297) - fVar202;
        fVar240 = (float)((uint)fVar271 & uVar73 | ~uVar73 & (uint)fVar119) - fVar298;
        fVar249 = (float)((uint)fVar274 & uVar70 | ~uVar70 & (uint)fVar156) - fVar307;
        fVar261 = (float)((uint)fVar281 & uVar72 | ~uVar72 & (uint)fVar169) - fVar204;
        fVar297 = (float)((uint)fVar282 & uVar74 | ~uVar74 & (uint)fVar189) - fVar295;
        fVar271 = (float)((uint)fVar208 & uVar73 | ~uVar73 & (uint)fVar252) - fVar203;
        fVar274 = (float)((uint)fVar317 & uVar70 | ~uVar70 & (uint)fVar253) - fVar210;
        fVar281 = (float)((uint)fVar319 & uVar72 | ~uVar72 & (uint)fVar263) - fVar238;
        fVar282 = (float)((uint)fVar321 & uVar74 | ~uVar74 & (uint)fVar269) - fVar239;
        fVar317 = fVar206 - fVar248;
        fVar319 = fVar306 - fVar254;
        fVar321 = fVar192 - fVar262;
        fVar78 = fVar202 - fVar250;
        fVar252 = fVar298 - fVar154;
        fVar253 = fVar307 - fVar159;
        fVar263 = fVar204 - fVar171;
        fVar269 = fVar295 - fVar190;
        fVar119 = fVar203 - fVar207;
        fVar156 = fVar210 - fVar294;
        fVar169 = fVar238 - fVar296;
        fVar189 = fVar239 - fVar299;
        fVar305 = (fVar298 * fVar271 - fVar203 * fVar240) * 0.0 +
                  (fVar203 * fVar283 - fVar206 * fVar271) * 0.0 +
                  (fVar206 * fVar240 - fVar298 * fVar283);
        fVar308 = (fVar307 * fVar274 - fVar210 * fVar249) * 0.0 +
                  (fVar210 * fVar284 - fVar306 * fVar274) * 0.0 +
                  (fVar306 * fVar249 - fVar307 * fVar284);
        auVar180._4_4_ = fVar308;
        auVar180._0_4_ = fVar305;
        fVar205 = (fVar204 * fVar281 - fVar238 * fVar261) * 0.0 +
                  (fVar238 * fVar292 - fVar192 * fVar281) * 0.0 +
                  (fVar192 * fVar261 - fVar204 * fVar292);
        fVar208 = (fVar295 * fVar282 - fVar239 * fVar297) * 0.0 +
                  (fVar239 * fVar293 - fVar202 * fVar282) * 0.0 +
                  (fVar202 * fVar297 - fVar295 * fVar293);
        auVar310._0_4_ =
             (fVar154 * fVar119 - fVar207 * fVar252) * 0.0 +
             (fVar207 * fVar317 - fVar248 * fVar119) * 0.0 + (fVar248 * fVar252 - fVar154 * fVar317)
        ;
        auVar310._4_4_ =
             (fVar159 * fVar156 - fVar294 * fVar253) * 0.0 +
             (fVar294 * fVar319 - fVar254 * fVar156) * 0.0 + (fVar254 * fVar253 - fVar159 * fVar319)
        ;
        auVar310._8_4_ =
             (fVar171 * fVar169 - fVar296 * fVar263) * 0.0 +
             (fVar296 * fVar321 - fVar262 * fVar169) * 0.0 + (fVar262 * fVar263 - fVar171 * fVar321)
        ;
        auVar310._12_4_ =
             (fVar190 * fVar189 - fVar299 * fVar269) * 0.0 +
             (fVar299 * fVar78 - fVar250 * fVar189) * 0.0 + (fVar250 * fVar269 - fVar190 * fVar78);
        auVar180._8_4_ = fVar205;
        auVar180._12_4_ = fVar208;
        auVar79 = maxps(auVar180,auVar310);
        bVar51 = auVar79._0_4_ <= 0.0 && bVar51;
        auVar181._0_4_ = -(uint)bVar51;
        bVar52 = auVar79._4_4_ <= 0.0 && bVar52;
        auVar181._4_4_ = -(uint)bVar52;
        bVar50 = auVar79._8_4_ <= 0.0 && bVar50;
        auVar181._8_4_ = -(uint)bVar50;
        bVar49 = auVar79._12_4_ <= 0.0 && bVar49;
        auVar181._12_4_ = -(uint)bVar49;
        iVar54 = movmskps(iVar54,auVar181);
        if (iVar54 == 0) {
LAB_00b08f6f:
          auVar182._8_8_ = uStack_3b0;
          auVar182._0_8_ = local_3b8;
        }
        else {
          auVar196._0_4_ = fVar119 * fVar240;
          auVar196._4_4_ = fVar156 * fVar249;
          auVar196._8_4_ = fVar169 * fVar261;
          auVar196._12_4_ = fVar189 * fVar297;
          fVar248 = fVar252 * fVar271 - auVar196._0_4_;
          fVar254 = fVar253 * fVar274 - auVar196._4_4_;
          fVar262 = fVar263 * fVar281 - auVar196._8_4_;
          fVar250 = fVar269 * fVar282 - auVar196._12_4_;
          fVar119 = fVar119 * fVar283 - fVar271 * fVar317;
          fVar156 = fVar156 * fVar284 - fVar274 * fVar319;
          fVar169 = fVar169 * fVar292 - fVar281 * fVar321;
          fVar189 = fVar189 * fVar293 - fVar282 * fVar78;
          fVar240 = fVar317 * fVar240 - fVar252 * fVar283;
          fVar249 = fVar319 * fVar249 - fVar253 * fVar284;
          fVar261 = fVar321 * fVar261 - fVar263 * fVar292;
          fVar297 = fVar78 * fVar297 - fVar269 * fVar293;
          auVar228._0_4_ = fVar248 * 0.0 + fVar119 * 0.0 + fVar240;
          auVar228._4_4_ = fVar254 * 0.0 + fVar156 * 0.0 + fVar249;
          auVar228._8_4_ = fVar262 * 0.0 + fVar169 * 0.0 + fVar261;
          auVar228._12_4_ = fVar250 * 0.0 + fVar189 * 0.0 + fVar297;
          auVar79 = rcpps(auVar196,auVar228);
          fVar154 = auVar79._0_4_;
          fVar159 = auVar79._4_4_;
          fVar171 = auVar79._8_4_;
          fVar190 = auVar79._12_4_;
          fVar154 = (1.0 - auVar228._0_4_ * fVar154) * fVar154 + fVar154;
          fVar159 = (1.0 - auVar228._4_4_ * fVar159) * fVar159 + fVar159;
          fVar171 = (1.0 - auVar228._8_4_ * fVar171) * fVar171 + fVar171;
          fVar190 = (1.0 - auVar228._12_4_ * fVar190) * fVar190 + fVar190;
          fVar203 = (fVar203 * fVar240 + fVar298 * fVar119 + fVar206 * fVar248) * fVar154;
          fVar156 = (fVar210 * fVar249 + fVar307 * fVar156 + fVar306 * fVar254) * fVar159;
          fVar169 = (fVar238 * fVar261 + fVar204 * fVar169 + fVar192 * fVar262) * fVar171;
          fVar189 = (fVar239 * fVar297 + fVar295 * fVar189 + fVar202 * fVar250) * fVar190;
          fVar119 = *(float *)(ray + k * 4 + 0x80);
          bVar51 = (fVar203 <= fVar119 && fVar170 <= fVar203) && bVar51;
          auVar100._0_4_ = -(uint)bVar51;
          bVar52 = (fVar156 <= fVar119 && fVar170 <= fVar156) && bVar52;
          auVar100._4_4_ = -(uint)bVar52;
          bVar50 = (fVar169 <= fVar119 && fVar170 <= fVar169) && bVar50;
          auVar100._8_4_ = -(uint)bVar50;
          bVar49 = (fVar189 <= fVar119 && fVar170 <= fVar189) && bVar49;
          auVar100._12_4_ = -(uint)bVar49;
          iVar54 = movmskps(iVar54,auVar100);
          if (iVar54 == 0) goto LAB_00b08f6f;
          auVar101._0_8_ =
               CONCAT44(-(uint)(auVar228._4_4_ != 0.0 && bVar52),
                        -(uint)(auVar228._0_4_ != 0.0 && bVar51));
          auVar101._8_4_ = -(uint)(auVar228._8_4_ != 0.0 && bVar50);
          auVar101._12_4_ = -(uint)(auVar228._12_4_ != 0.0 && bVar49);
          iVar54 = movmskps(iVar54,auVar101);
          auVar182._8_8_ = uStack_3b0;
          auVar182._0_8_ = local_3b8;
          if (iVar54 != 0) {
            fVar305 = fVar305 * fVar154;
            fVar308 = fVar308 * fVar159;
            fVar205 = fVar205 * fVar171;
            fVar208 = fVar208 * fVar190;
            local_408 = (float)((uint)(1.0 - fVar305) & uVar73 | ~uVar73 & (uint)fVar305);
            fStack_404 = (float)((uint)(1.0 - fVar308) & uVar70 | ~uVar70 & (uint)fVar308);
            fStack_400 = (float)((uint)(1.0 - fVar205) & uVar72 | ~uVar72 & (uint)fVar205);
            fStack_3fc = (float)((uint)(1.0 - fVar208) & uVar74 | ~uVar74 & (uint)fVar208);
            local_268 = (float)(~uVar73 & (uint)(auVar310._0_4_ * fVar154) |
                               (uint)(1.0 - auVar310._0_4_ * fVar154) & uVar73);
            fStack_264 = (float)(~uVar70 & (uint)(auVar310._4_4_ * fVar159) |
                                (uint)(1.0 - auVar310._4_4_ * fVar159) & uVar70);
            fStack_260 = (float)(~uVar72 & (uint)(auVar310._8_4_ * fVar171) |
                                (uint)(1.0 - auVar310._8_4_ * fVar171) & uVar72);
            fStack_25c = (float)(~uVar74 & (uint)(auVar310._12_4_ * fVar190) |
                                (uint)(1.0 - auVar310._12_4_ * fVar190) & uVar74);
            auVar182._8_4_ = auVar101._8_4_;
            auVar182._0_8_ = auVar101._0_8_;
            auVar182._12_4_ = auVar101._12_4_;
            local_418 = fVar203;
            fStack_414 = fVar156;
            fStack_410 = fVar169;
            fStack_40c = fVar189;
          }
        }
        iVar54 = movmskps(iVar54,auVar182);
        _local_368 = auVar246;
        if (iVar54 != 0) {
          fVar119 = (auVar246._0_4_ - (float)local_358._0_4_) * local_408 + (float)local_358._0_4_;
          fVar154 = (auVar246._4_4_ - (float)local_358._4_4_) * fStack_404 + (float)local_358._4_4_;
          fVar156 = (auVar246._8_4_ - fStack_350) * fStack_400 + fStack_350;
          fVar159 = (auVar246._12_4_ - fStack_34c) * fStack_3fc + fStack_34c;
          fVar170 = *(float *)((long)local_3d0->ray_space + k * 4 + -0x10);
          auVar102._0_4_ = -(uint)(fVar170 * (fVar119 + fVar119) < local_418) & auVar182._0_4_;
          auVar102._4_4_ = -(uint)(fVar170 * (fVar154 + fVar154) < fStack_414) & auVar182._4_4_;
          auVar102._8_4_ = -(uint)(fVar170 * (fVar156 + fVar156) < fStack_410) & auVar182._8_4_;
          auVar102._12_4_ = -(uint)(fVar170 * (fVar159 + fVar159) < fStack_40c) & auVar182._12_4_;
          iVar54 = movmskps((int)local_3d0,auVar102);
          if (iVar54 != 0) {
            local_268 = local_268 + local_268 + -1.0;
            fStack_264 = fStack_264 + fStack_264 + -1.0;
            fStack_260 = fStack_260 + fStack_260 + -1.0;
            fStack_25c = fStack_25c + fStack_25c + -1.0;
            local_1e8 = 0;
            local_1d8 = CONCAT44(fStack_384,local_388);
            uStack_1d0 = CONCAT44(fStack_37c,fStack_380);
            local_1c8 = CONCAT44(fStack_394,local_398);
            uStack_1c0 = CONCAT44(fStack_38c,fStack_390);
            local_1b8 = CONCAT44(fStack_3a4,local_3a8);
            uStack_1b0 = CONCAT44(fStack_39c,fStack_3a0);
            local_1a8 = CONCAT44(fStack_374,local_378);
            uStack_1a0 = CONCAT44(fStack_36c,fStack_370);
            local_218 = local_408;
            fStack_214 = fStack_404;
            fStack_210 = fStack_400;
            fStack_20c = fStack_3fc;
            local_208 = local_268;
            fStack_204 = fStack_264;
            fStack_200 = fStack_260;
            fStack_1fc = fStack_25c;
            local_1f8 = local_418;
            fStack_1f4 = fStack_414;
            fStack_1f0 = fStack_410;
            fStack_1ec = fStack_40c;
            local_1e4 = iVar21;
            local_198 = auVar102;
            if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar113 = 1.0 / fVar113;
              local_188[0] = fVar113 * (local_408 + 0.0);
              local_188[1] = fVar113 * (fStack_404 + 1.0);
              local_188[2] = fVar113 * (fStack_400 + 2.0);
              local_188[3] = fVar113 * (fStack_3fc + 3.0);
              local_178 = CONCAT44(fStack_264,local_268);
              uStack_170 = CONCAT44(fStack_25c,fStack_260);
              local_168[0] = local_418;
              local_168[1] = fStack_414;
              local_168[2] = fStack_410;
              local_168[3] = fStack_40c;
              auVar136._0_4_ = auVar102._0_4_ & (uint)local_418;
              auVar136._4_4_ = auVar102._4_4_ & (uint)fStack_414;
              auVar136._8_4_ = auVar102._8_4_ & (uint)fStack_410;
              auVar136._12_4_ = auVar102._12_4_ & (uint)fStack_40c;
              auVar162._0_8_ = CONCAT44(~auVar102._4_4_,~auVar102._0_4_) & 0x7f8000007f800000;
              auVar162._8_4_ = ~auVar102._8_4_ & 0x7f800000;
              auVar162._12_4_ = ~auVar102._12_4_ & 0x7f800000;
              auVar162 = auVar162 | auVar136;
              auVar183._4_4_ = auVar162._0_4_;
              auVar183._0_4_ = auVar162._4_4_;
              auVar183._8_4_ = auVar162._12_4_;
              auVar183._12_4_ = auVar162._8_4_;
              auVar79 = minps(auVar183,auVar162);
              auVar137._0_8_ = auVar79._8_8_;
              auVar137._8_4_ = auVar79._0_4_;
              auVar137._12_4_ = auVar79._4_4_;
              auVar79 = minps(auVar137,auVar79);
              auVar138._0_8_ =
                   CONCAT44(-(uint)(auVar79._4_4_ == auVar162._4_4_) & auVar102._4_4_,
                            -(uint)(auVar79._0_4_ == auVar162._0_4_) & auVar102._0_4_);
              auVar138._8_4_ = -(uint)(auVar79._8_4_ == auVar162._8_4_) & auVar102._8_4_;
              auVar138._12_4_ = -(uint)(auVar79._12_4_ == auVar162._12_4_) & auVar102._12_4_;
              iVar54 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar138);
              auVar103 = auVar102;
              if (iVar54 != 0) {
                auVar103._8_4_ = auVar138._8_4_;
                auVar103._0_8_ = auVar138._0_8_;
                auVar103._12_4_ = auVar138._12_4_;
              }
              uVar73 = movmskps(iVar54,auVar103);
              lVar66 = 0;
              if (uVar73 != 0) {
                for (; (uVar73 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
                }
              }
              local_3f8 = auVar102;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar170 = local_188[lVar66];
                uVar55 = *(undefined4 *)((long)&local_178 + lVar66 * 4);
                fVar154 = 1.0 - fVar170;
                fVar156 = fVar170 * fVar154 * 4.0;
                fVar113 = -fVar154 * fVar154 * 0.5;
                fVar119 = (-fVar170 * fVar170 - fVar156) * 0.5;
                fVar154 = (fVar154 * fVar154 + fVar156) * 0.5;
                fVar156 = fVar170 * fVar170 * 0.5;
                *(float *)(ray + k * 4 + 0x80) = local_168[lVar66];
                *(float *)(ray + k * 4 + 0xc0) =
                     fVar113 * local_388 +
                     fVar119 * local_398 + fVar154 * local_3a8 + fVar156 * local_378;
                *(float *)(ray + k * 4 + 0xd0) =
                     fVar113 * fStack_384 +
                     fVar119 * fStack_394 + fVar154 * fStack_3a4 + fVar156 * fStack_374;
                *(float *)(ray + k * 4 + 0xe0) =
                     fVar113 * fStack_380 +
                     fVar119 * fStack_390 + fVar154 * fStack_3a0 + fVar156 * fStack_370;
                *(float *)(ray + k * 4 + 0xf0) = fVar170;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar55;
                *(uint *)(ray + k * 4 + 0x110) = uVar71;
                *(uint *)(ray + k * 4 + 0x120) = uVar69;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                pRVar62 = (RTCIntersectArguments *)context;
              }
              else {
                local_4f8 = CONCAT44(uVar71,uVar71);
                uStack_4f0._0_4_ = uVar71;
                uStack_4f0._4_4_ = uVar71;
                auVar79 = *local_2a8;
                _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                while( true ) {
                  local_e8 = local_188[lVar66];
                  local_d8 = *(undefined4 *)((long)&local_178 + lVar66 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_168[lVar66];
                  fVar154 = 1.0 - local_e8;
                  fVar170 = local_e8 * fVar154 * 4.0;
                  fVar156 = (fVar154 * fVar154 + fVar170) * 0.5;
                  fVar119 = local_e8 * local_e8 * 0.5;
                  fVar113 = (-local_e8 * local_e8 - fVar170) * 0.5;
                  local_348.context = context->user;
                  fVar170 = -fVar154 * fVar154 * 0.5;
                  local_118._0_4_ =
                       fVar170 * local_388 +
                       fVar113 * local_398 + fVar156 * local_3a8 + fVar119 * local_378;
                  local_108 = fVar170 * fStack_384 +
                              fVar113 * fStack_394 + fVar156 * fStack_3a4 + fVar119 * fStack_374;
                  local_f8 = fVar170 * fStack_380 +
                             fVar113 * fStack_390 + fVar156 * fStack_3a0 + fVar119 * fStack_370;
                  local_118._4_4_ = local_118._0_4_;
                  local_118._8_4_ = local_118._0_4_;
                  fStack_10c = (float)local_118._0_4_;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  uStack_d4 = local_d8;
                  uStack_d0 = local_d8;
                  uStack_cc = local_d8;
                  local_c8 = local_4f8;
                  uStack_c0 = uStack_4f0;
                  local_b8 = CONCAT44(uVar69,uVar69);
                  uStack_b0 = CONCAT44(uVar69,uVar69);
                  local_a8 = (local_348.context)->instID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_98 = (local_348.context)->instPrimID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_348.valid = (int *)local_3e8;
                  pRVar62 = (RTCIntersectArguments *)pGVar22->userPtr;
                  local_348.hit = (RTCHitN *)local_118;
                  local_348.N = 4;
                  p_Var57 = pGVar22->intersectionFilterN;
                  auVar323._8_8_ = pGVar65;
                  auVar323._0_8_ = p_Var57;
                  local_3e8 = auVar79;
                  local_348.geometryUserPtr = pRVar62;
                  local_348.ray = (RTCRayN *)ray;
                  if (p_Var57 != (RTCFilterFunctionN)0x0) {
                    auVar323 = (*p_Var57)(&local_348);
                    ray = local_2a0;
                  }
                  pGVar65 = auVar323._8_8_;
                  auVar149._0_4_ = -(uint)(local_3e8._0_4_ == 0);
                  auVar149._4_4_ = -(uint)(local_3e8._4_4_ == 0);
                  auVar149._8_4_ = -(uint)(local_3e8._8_4_ == 0);
                  auVar149._12_4_ = -(uint)(local_3e8._12_4_ == 0);
                  uVar73 = movmskps(auVar323._0_4_,auVar149);
                  pRVar58 = (RayHitK<4> *)(ulong)(uVar73 ^ 0xf);
                  if ((uVar73 ^ 0xf) == 0) {
                    auVar149 = auVar149 ^ _DAT_01f7ae20;
                  }
                  else {
                    pRVar62 = context->args;
                    pRVar59 = (RTCIntersectArguments *)pRVar62->filter;
                    auVar53._8_8_ = pGVar65;
                    auVar53._0_8_ = pRVar59;
                    auVar324._8_8_ = pGVar65;
                    auVar324._0_8_ = pRVar59;
                    if ((pRVar59 != (RTCIntersectArguments *)0x0) &&
                       ((((ulong)*(Scene **)&pRVar62->flags & 2) != 0 ||
                        (auVar324 = auVar53, ((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar324 = (*(code *)pRVar59)(&local_348);
                      ray = local_2a0;
                    }
                    pGVar65 = auVar324._8_8_;
                    auVar109._0_4_ = -(uint)(local_3e8._0_4_ == 0);
                    auVar109._4_4_ = -(uint)(local_3e8._4_4_ == 0);
                    auVar109._8_4_ = -(uint)(local_3e8._8_4_ == 0);
                    auVar109._12_4_ = -(uint)(local_3e8._12_4_ == 0);
                    auVar149 = auVar109 ^ _DAT_01f7ae20;
                    uVar73 = movmskps(auVar324._0_4_,auVar109);
                    pRVar58 = (RayHitK<4> *)(ulong)(uVar73 ^ 0xf);
                    if ((uVar73 ^ 0xf) != 0) {
                      RVar26 = *(RTCFeatureFlags *)((long)local_348.hit + 4);
                      uVar73 = *(uint *)((long)local_348.hit + 8);
                      uVar70 = *(uint *)((long)((long)local_348.hit + 8) + 4);
                      *(uint *)(local_348.ray + 0xc0) =
                           ~auVar109._0_4_ & *(uint *)&(local_348.hit)->field_0x0 |
                           *(uint *)(local_348.ray + 0xc0) & auVar109._0_4_;
                      *(RTCFeatureFlags *)(local_348.ray + 0xc4) =
                           ~auVar109._4_4_ & RVar26 |
                           *(RTCFeatureFlags *)(local_348.ray + 0xc4) & auVar109._4_4_;
                      *(uint *)(local_348.ray + 200) =
                           ~auVar109._8_4_ & uVar73 |
                           *(uint *)(local_348.ray + 200) & auVar109._8_4_;
                      *(uint *)(local_348.ray + 0xcc) =
                           ~auVar109._12_4_ & uVar70 |
                           *(uint *)(local_348.ray + 0xcc) & auVar109._12_4_;
                      RVar26 = *(RTCFeatureFlags *)((long)((long)local_348.hit + 0x10) + 4);
                      uVar73 = *(uint *)((long)local_348.hit + 0x18);
                      uVar70 = *(uint *)((long)((long)local_348.hit + 0x18) + 4);
                      *(uint *)(local_348.ray + 0xd0) =
                           ~auVar109._0_4_ & *(uint *)((long)local_348.hit + 0x10) |
                           *(uint *)(local_348.ray + 0xd0) & auVar109._0_4_;
                      *(RTCFeatureFlags *)(local_348.ray + 0xd4) =
                           ~auVar109._4_4_ & RVar26 |
                           *(RTCFeatureFlags *)(local_348.ray + 0xd4) & auVar109._4_4_;
                      *(uint *)(local_348.ray + 0xd8) =
                           ~auVar109._8_4_ & uVar73 |
                           *(uint *)(local_348.ray + 0xd8) & auVar109._8_4_;
                      *(uint *)(local_348.ray + 0xdc) =
                           ~auVar109._12_4_ & uVar70 |
                           *(uint *)(local_348.ray + 0xdc) & auVar109._12_4_;
                      RVar26 = ((RTCIntersectArguments *)((long)local_348.hit + 0x20))->feature_mask
                      ;
                      uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))->
                                         context;
                      uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_348.hit + 0x20))->context + 4);
                      *(RTCRayQueryFlags *)(local_348.ray + 0xe0) =
                           ~auVar109._0_4_ &
                           ((RTCIntersectArguments *)((long)local_348.hit + 0x20))->flags |
                           *(uint *)(local_348.ray + 0xe0) & auVar109._0_4_;
                      *(RTCFeatureFlags *)(local_348.ray + 0xe4) =
                           ~auVar109._4_4_ & RVar26 |
                           *(RTCFeatureFlags *)(local_348.ray + 0xe4) & auVar109._4_4_;
                      *(uint *)(local_348.ray + 0xe8) =
                           ~auVar109._8_4_ & uVar73 |
                           *(uint *)(local_348.ray + 0xe8) & auVar109._8_4_;
                      *(uint *)(local_348.ray + 0xec) =
                           ~auVar109._12_4_ & uVar70 |
                           *(uint *)(local_348.ray + 0xec) & auVar109._12_4_;
                      RVar26 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))->
                                        filter + 4);
                      uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))->
                                         intersect;
                      uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_348.hit + 0x20))->intersect + 4);
                      *(uint *)(local_348.ray + 0xf0) =
                           ~auVar109._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))->filter
                           | *(uint *)(local_348.ray + 0xf0) & auVar109._0_4_;
                      *(RTCFeatureFlags *)(local_348.ray + 0xf4) =
                           ~auVar109._4_4_ & RVar26 |
                           *(RTCFeatureFlags *)(local_348.ray + 0xf4) & auVar109._4_4_;
                      *(uint *)(local_348.ray + 0xf8) =
                           ~auVar109._8_4_ & uVar73 |
                           *(uint *)(local_348.ray + 0xf8) & auVar109._8_4_;
                      *(uint *)(local_348.ray + 0xfc) =
                           ~auVar109._12_4_ & uVar70 |
                           *(uint *)(local_348.ray + 0xfc) & auVar109._12_4_;
                      RVar26 = ((RTCIntersectArguments *)((long)local_348.hit + 0x40))->feature_mask
                      ;
                      uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))->
                                         context;
                      uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_348.hit + 0x40))->context + 4);
                      *(RTCRayQueryFlags *)(local_348.ray + 0x100) =
                           ~auVar109._0_4_ &
                           ((RTCIntersectArguments *)((long)local_348.hit + 0x40))->flags |
                           *(uint *)(local_348.ray + 0x100) & auVar109._0_4_;
                      *(RTCFeatureFlags *)(local_348.ray + 0x104) =
                           ~auVar109._4_4_ & RVar26 |
                           *(RTCFeatureFlags *)(local_348.ray + 0x104) & auVar109._4_4_;
                      *(uint *)(local_348.ray + 0x108) =
                           ~auVar109._8_4_ & uVar73 |
                           *(uint *)(local_348.ray + 0x108) & auVar109._8_4_;
                      *(uint *)(local_348.ray + 0x10c) =
                           ~auVar109._12_4_ & uVar70 |
                           *(uint *)(local_348.ray + 0x10c) & auVar109._12_4_;
                      RVar26 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))->
                                        filter + 4);
                      uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))->
                                         intersect;
                      uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_348.hit + 0x40))->intersect + 4);
                      *(uint *)(local_348.ray + 0x110) =
                           *(uint *)(local_348.ray + 0x110) & auVar109._0_4_ |
                           ~auVar109._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))->filter
                      ;
                      *(RTCFeatureFlags *)(local_348.ray + 0x114) =
                           *(RTCFeatureFlags *)(local_348.ray + 0x114) & auVar109._4_4_ |
                           ~auVar109._4_4_ & RVar26;
                      *(uint *)(local_348.ray + 0x118) =
                           *(uint *)(local_348.ray + 0x118) & auVar109._8_4_ |
                           ~auVar109._8_4_ & uVar73;
                      *(uint *)(local_348.ray + 0x11c) =
                           *(uint *)(local_348.ray + 0x11c) & auVar109._12_4_ |
                           ~auVar109._12_4_ & uVar70;
                      RVar26 = ((RTCIntersectArguments *)((long)local_348.hit + 0x60))->feature_mask
                      ;
                      uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))->
                                         context;
                      uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_348.hit + 0x60))->context + 4);
                      *(RTCRayQueryFlags *)(local_348.ray + 0x120) =
                           *(uint *)(local_348.ray + 0x120) & auVar109._0_4_ |
                           ~auVar109._0_4_ &
                           ((RTCIntersectArguments *)((long)local_348.hit + 0x60))->flags;
                      *(RTCFeatureFlags *)(local_348.ray + 0x124) =
                           *(RTCFeatureFlags *)(local_348.ray + 0x124) & auVar109._4_4_ |
                           ~auVar109._4_4_ & RVar26;
                      *(uint *)(local_348.ray + 0x128) =
                           *(uint *)(local_348.ray + 0x128) & auVar109._8_4_ |
                           ~auVar109._8_4_ & uVar73;
                      *(uint *)(local_348.ray + 300) =
                           *(uint *)(local_348.ray + 300) & auVar109._12_4_ |
                           ~auVar109._12_4_ & uVar70;
                      RVar26 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))->
                                        filter + 4);
                      uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))->
                                         intersect;
                      uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_348.hit + 0x60))->intersect + 4);
                      *(uint *)(local_348.ray + 0x130) =
                           ~auVar109._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))->filter
                           | *(uint *)(local_348.ray + 0x130) & auVar109._0_4_;
                      *(RTCFeatureFlags *)(local_348.ray + 0x134) =
                           ~auVar109._4_4_ & RVar26 |
                           *(RTCFeatureFlags *)(local_348.ray + 0x134) & auVar109._4_4_;
                      *(uint *)(local_348.ray + 0x138) =
                           ~auVar109._8_4_ & uVar73 |
                           *(uint *)(local_348.ray + 0x138) & auVar109._8_4_;
                      *(uint *)(local_348.ray + 0x13c) =
                           ~auVar109._12_4_ & uVar70 |
                           *(uint *)(local_348.ray + 0x13c) & auVar109._12_4_;
                      auVar19._0_4_ = *(undefined4 *)(local_348.hit + 0x80);
                      auVar19._4_4_ = *(undefined4 *)(local_348.hit + 0x84);
                      auVar19._8_8_ = *(undefined8 *)(local_348.hit + 0x88);
                      *(undefined1 (*) [16])(local_348.ray + 0x140) =
                           ~auVar109 & auVar19 |
                           *(undefined1 (*) [16])(local_348.ray + 0x140) & auVar109;
                      pRVar58 = (RayHitK<4> *)local_348.ray;
                      pRVar62 = (RTCIntersectArguments *)local_348.hit;
                    }
                  }
                  auVar150._0_4_ = auVar149._0_4_ << 0x1f;
                  auVar150._4_4_ = auVar149._4_4_ << 0x1f;
                  auVar150._8_4_ = auVar149._8_4_ << 0x1f;
                  auVar150._12_4_ = auVar149._12_4_ << 0x1f;
                  iVar54 = movmskps((int)pRVar58,auVar150);
                  if (iVar54 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                  }
                  else {
                    local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_518._4_4_ = 0;
                    fStack_510 = 0.0;
                    uStack_50c = 0;
                  }
                  *(undefined4 *)(local_3f8 + lVar66 * 4) = 0;
                  local_3f8._0_4_ = -(uint)(local_418 <= (float)local_518._0_4_) & local_3f8._0_4_;
                  local_3f8._4_4_ = -(uint)(fStack_414 <= (float)local_518._0_4_) & local_3f8._4_4_;
                  local_3f8._8_4_ = -(uint)(fStack_410 <= (float)local_518._0_4_) & local_3f8._8_4_;
                  local_3f8._12_4_ =
                       -(uint)(fStack_40c <= (float)local_518._0_4_) & local_3f8._12_4_;
                  iVar54 = movmskps(iVar54,local_3f8);
                  if (iVar54 == 0) break;
                  auVar151._0_4_ = local_3f8._0_4_ & (uint)local_418;
                  auVar151._4_4_ = local_3f8._4_4_ & (uint)fStack_414;
                  auVar151._8_4_ = local_3f8._8_4_ & (uint)fStack_410;
                  auVar151._12_4_ = local_3f8._12_4_ & (uint)fStack_40c;
                  auVar168._0_8_ = CONCAT44(~local_3f8._4_4_,~local_3f8._0_4_) & 0x7f8000007f800000;
                  auVar168._8_4_ = ~local_3f8._8_4_ & 0x7f800000;
                  auVar168._12_4_ = ~local_3f8._12_4_ & 0x7f800000;
                  auVar168 = auVar168 | auVar151;
                  auVar188._4_4_ = auVar168._0_4_;
                  auVar188._0_4_ = auVar168._4_4_;
                  auVar188._8_4_ = auVar168._12_4_;
                  auVar188._12_4_ = auVar168._8_4_;
                  auVar161 = minps(auVar188,auVar168);
                  auVar152._0_8_ = auVar161._8_8_;
                  auVar152._8_4_ = auVar161._0_4_;
                  auVar152._12_4_ = auVar161._4_4_;
                  auVar161 = minps(auVar152,auVar161);
                  auVar153._0_8_ =
                       CONCAT44(-(uint)(auVar161._4_4_ == auVar168._4_4_) & local_3f8._4_4_,
                                -(uint)(auVar161._0_4_ == auVar168._0_4_) & local_3f8._0_4_);
                  auVar153._8_4_ = -(uint)(auVar161._8_4_ == auVar168._8_4_) & local_3f8._8_4_;
                  auVar153._12_4_ = -(uint)(auVar161._12_4_ == auVar168._12_4_) & local_3f8._12_4_;
                  iVar54 = movmskps(iVar54,auVar153);
                  auVar110 = local_3f8;
                  if (iVar54 != 0) {
                    auVar110._8_4_ = auVar153._8_4_;
                    auVar110._0_8_ = auVar153._0_8_;
                    auVar110._12_4_ = auVar153._12_4_;
                  }
                  uVar55 = movmskps(iVar54,auVar110);
                  uVar60 = CONCAT44((int)((ulong)pRVar58 >> 0x20),uVar55);
                  lVar66 = 0;
                  if (uVar60 != 0) {
                    for (; (uVar60 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
                    }
                  }
                }
              }
              iVar61 = (int)pRVar62;
            }
          }
        }
      }
      if (4 < iVar21) {
        local_58 = iVar21;
        iStack_54 = iVar21;
        iStack_50 = iVar21;
        iStack_4c = iVar21;
        local_288._4_4_ = local_288._0_4_;
        fStack_280 = (float)local_288._0_4_;
        fStack_27c = (float)local_288._0_4_;
        local_88 = 1.0 / (float)local_298._0_4_;
        fStack_84 = local_88;
        fStack_80 = local_88;
        fStack_7c = local_88;
        local_68 = uVar69;
        uStack_64 = uVar69;
        uStack_60 = uVar69;
        uStack_5c = uVar69;
        local_78 = uVar71;
        uStack_74 = uVar71;
        uStack_70 = uVar71;
        uStack_6c = uVar71;
        lVar66 = 4;
        do {
          uVar70 = (uint)lVar66;
          pRVar62 = (RTCIntersectArguments *)(bspline_basis0 + lVar24);
          pfVar1 = (float *)((long)&pRVar62->flags + lVar66 * 4);
          fVar170 = *pfVar1;
          fVar113 = pfVar1[1];
          fVar119 = pfVar1[2];
          fVar154 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21aefac + lVar66 * 4);
          fVar156 = *pfVar1;
          fVar159 = pfVar1[1];
          fVar169 = pfVar1[2];
          fVar171 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21af430 + lVar66 * 4);
          local_2f8 = *pfVar1;
          fStack_2f4 = pfVar1[1];
          fStack_2f0 = pfVar1[2];
          fStack_2ec = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21af8b4 + lVar66 * 4);
          local_2e8 = *pfVar1;
          fStack_2e4 = pfVar1[1];
          fStack_2e0 = pfVar1[2];
          fStack_2dc = pfVar1[3];
          local_368._0_4_ =
               local_238 * fVar170 + fVar232 * fVar156 + fVar234 * local_2f8 + fVar115 * local_2e8;
          local_368._4_4_ =
               fStack_234 * fVar113 +
               fVar232 * fVar159 + fVar234 * fStack_2f4 + fVar115 * fStack_2e4;
          fStack_360 = fStack_230 * fVar119 +
                       fVar232 * fVar169 + fVar234 * fStack_2f0 + fVar115 * fStack_2e0;
          fStack_35c = fStack_22c * fVar154 +
                       fVar232 * fVar171 + fVar234 * fStack_2ec + fVar115 * fStack_2dc;
          local_258 = local_248 * fVar170 +
                      fVar233 * fVar156 + local_2c8 * local_2f8 + local_2d8 * local_2e8;
          fStack_254 = fStack_244 * fVar113 +
                       fVar233 * fVar159 + fStack_2c4 * fStack_2f4 + fStack_2d4 * fStack_2e4;
          fStack_250 = fStack_240 * fVar119 +
                       fVar233 * fVar169 + fStack_2c0 * fStack_2f0 + fStack_2d0 * fStack_2e0;
          fStack_24c = fStack_23c * fVar154 +
                       fVar233 * fVar171 + fStack_2bc * fStack_2ec + fStack_2cc * fStack_2dc;
          auVar140._0_4_ =
               local_158 * fVar170 +
               local_148 * fVar156 + local_128 * local_2f8 + local_138 * local_2e8;
          auVar140._4_4_ =
               fStack_154 * fVar113 +
               fStack_144 * fVar159 + fStack_124 * fStack_2f4 + fStack_134 * fStack_2e4;
          auVar140._8_4_ =
               fStack_150 * fVar119 +
               fStack_140 * fVar169 + fStack_120 * fStack_2f0 + fStack_130 * fStack_2e0;
          auVar140._12_4_ =
               fStack_14c * fVar154 +
               fStack_13c * fVar171 + fStack_11c * fStack_2ec + fStack_12c * fStack_2dc;
          pfVar1 = (float *)(bspline_basis1 + lVar24 + lVar66 * 4);
          fVar189 = *pfVar1;
          fVar190 = pfVar1[1];
          fVar203 = pfVar1[2];
          fVar210 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21b13cc + lVar66 * 4);
          fVar238 = *pfVar1;
          fVar239 = pfVar1[1];
          fVar240 = pfVar1[2];
          fVar248 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21b1850 + lVar66 * 4);
          fVar249 = *pfVar1;
          fVar254 = pfVar1[1];
          fVar261 = pfVar1[2];
          fVar262 = pfVar1[3];
          pauVar8 = (undefined1 (*) [12])(lVar24 + 0x21b1cd4 + lVar66 * 4);
          fVar297 = *(float *)*pauVar8;
          fVar250 = *(float *)(*pauVar8 + 4);
          fVar252 = *(float *)(*pauVar8 + 8);
          auVar28 = *pauVar8;
          fVar253 = *(float *)pauVar8[1];
          local_358._0_4_ =
               local_238 * fVar189 + fVar232 * fVar238 + fVar234 * fVar249 + fVar115 * fVar297;
          local_358._4_4_ =
               fStack_234 * fVar190 + fVar232 * fVar239 + fVar234 * fVar254 + fVar115 * fVar250;
          fStack_350 = fStack_230 * fVar203 +
                       fVar232 * fVar240 + fVar234 * fVar261 + fVar115 * fVar252;
          fStack_34c = fStack_22c * fVar210 +
                       fVar232 * fVar248 + fVar234 * fVar262 + fVar115 * fVar253;
          fVar282 = local_248 * fVar189 +
                    fVar233 * fVar238 + local_2c8 * fVar249 + local_2d8 * fVar297;
          fVar283 = fStack_244 * fVar190 +
                    fVar233 * fVar239 + fStack_2c4 * fVar254 + fStack_2d4 * fVar250;
          fVar284 = fStack_240 * fVar203 +
                    fVar233 * fVar240 + fStack_2c0 * fVar261 + fStack_2d0 * fVar252;
          fVar292 = fStack_23c * fVar210 +
                    fVar233 * fVar248 + fStack_2bc * fVar262 + fStack_2cc * fVar253;
          auVar311._0_4_ =
               local_158 * fVar189 + local_148 * fVar238 + local_128 * fVar249 + local_138 * fVar297
          ;
          auVar311._4_4_ =
               fStack_154 * fVar190 +
               fStack_144 * fVar239 + fStack_124 * fVar254 + fStack_134 * fVar250;
          auVar311._8_4_ =
               fStack_150 * fVar203 +
               fStack_140 * fVar240 + fStack_120 * fVar261 + fStack_130 * fVar252;
          auVar311._12_4_ =
               fStack_14c * fVar210 +
               fStack_13c * fVar248 + fStack_11c * fVar262 + fStack_12c * fVar253;
          fVar269 = (float)local_358._0_4_ - (float)local_368._0_4_;
          fVar271 = (float)local_358._4_4_ - (float)local_368._4_4_;
          fVar274 = fStack_350 - fStack_360;
          fVar281 = fStack_34c - fStack_35c;
          fVar297 = fVar282 - local_258;
          fVar250 = fVar283 - fStack_254;
          fVar252 = fVar284 - fStack_250;
          fVar263 = fVar292 - fStack_24c;
          fVar293 = local_258 * fVar269 - (float)local_368._0_4_ * fVar297;
          fVar295 = fStack_254 * fVar271 - (float)local_368._4_4_ * fVar250;
          fVar298 = fStack_250 * fVar274 - fStack_360 * fVar252;
          fVar305 = fStack_24c * fVar281 - fStack_35c * fVar263;
          auVar79 = maxps(auVar140,auVar311);
          bVar49 = fVar293 * fVar293 <=
                   auVar79._0_4_ * auVar79._0_4_ * (fVar269 * fVar269 + fVar297 * fVar297) &&
                   (int)uVar70 < local_58;
          auVar247._0_4_ = -(uint)bVar49;
          bVar50 = fVar295 * fVar295 <=
                   auVar79._4_4_ * auVar79._4_4_ * (fVar271 * fVar271 + fVar250 * fVar250) &&
                   (int)(uVar70 | 1) < iStack_54;
          auVar247._4_4_ = -(uint)bVar50;
          bVar51 = fVar298 * fVar298 <=
                   auVar79._8_4_ * auVar79._8_4_ * (fVar274 * fVar274 + fVar252 * fVar252) &&
                   (int)(uVar70 | 2) < iStack_50;
          auVar247._8_4_ = -(uint)bVar51;
          bVar52 = fVar305 * fVar305 <=
                   auVar79._12_4_ * auVar79._12_4_ * (fVar281 * fVar281 + fVar263 * fVar263) &&
                   (int)(uVar70 | 3) < iStack_4c;
          auVar247._12_4_ = -(uint)bVar52;
          uVar73 = movmskps((int)pGVar65,auVar247);
          pGVar65 = (Geometry *)(ulong)uVar73;
          if (uVar73 != 0) {
            local_298._4_4_ = fVar271;
            local_298._0_4_ = fVar269;
            fStack_290 = fVar274;
            fStack_28c = fVar281;
            local_518._0_4_ = auVar28._0_4_;
            local_518._4_4_ = auVar28._4_4_;
            fStack_510 = auVar28._8_4_;
            fVar319 = (float)local_518._0_4_ * fVar77 + fVar249 * fVar201 + fVar238 * local_2b8 +
                      fVar189 * fVar191;
            fVar321 = (float)local_518._4_4_ * fVar77 + fVar254 * fVar201 + fVar239 * fStack_2b4 +
                      fVar190 * fVar191;
            fVar294 = fStack_510 * fVar77 + fVar261 * fVar201 + fVar240 * fStack_2b0 +
                      fVar203 * fVar191;
            fVar296 = fVar253 * fVar77 + fVar262 * fVar201 + fVar248 * fStack_2ac +
                      fVar210 * fVar191;
            fVar116 = local_2e8 * fVar77 + local_2f8 * fVar201 + fVar156 * local_2b8 +
                      fVar170 * fVar191;
            fVar118 = fStack_2e4 * fVar77 + fStack_2f4 * fVar201 + fVar159 * fStack_2b4 +
                      fVar113 * fVar191;
            fVar120 = fStack_2e0 * fVar77 + fStack_2f0 * fVar201 + fVar169 * fStack_2b0 +
                      fVar119 * fVar191;
            fVar155 = fStack_2dc * fVar77 + fStack_2ec * fVar201 + fVar171 * fStack_2ac +
                      fVar154 * fVar191;
            pfVar1 = (float *)(lVar24 + 0x21afd38 + lVar66 * 4);
            fVar170 = *pfVar1;
            fVar113 = pfVar1[1];
            fVar119 = pfVar1[2];
            fVar154 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21b01bc + lVar66 * 4);
            fVar156 = *pfVar1;
            fVar159 = pfVar1[1];
            fVar169 = pfVar1[2];
            fVar171 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21b0640 + lVar66 * 4);
            fVar189 = *pfVar1;
            fVar190 = pfVar1[1];
            fVar203 = pfVar1[2];
            fVar210 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21b0ac4 + lVar66 * 4);
            fVar238 = *pfVar1;
            fVar239 = pfVar1[1];
            fVar240 = pfVar1[2];
            fVar248 = pfVar1[3];
            fVar157 = local_238 * fVar170 +
                      fVar232 * fVar156 + fVar234 * fVar189 + fVar115 * fVar238;
            fVar158 = fStack_234 * fVar113 +
                      fVar232 * fVar159 + fVar234 * fVar190 + fVar115 * fVar239;
            fVar192 = fStack_230 * fVar119 +
                      fVar232 * fVar169 + fVar234 * fVar203 + fVar115 * fVar240;
            fVar202 = fStack_22c * fVar154 +
                      fVar232 * fVar171 + fVar234 * fVar210 + fVar115 * fVar248;
            fVar299 = local_248 * fVar170 +
                      fVar233 * fVar156 + local_2c8 * fVar189 + local_2d8 * fVar238;
            fVar306 = fStack_244 * fVar113 +
                      fVar233 * fVar159 + fStack_2c4 * fVar190 + fStack_2d4 * fVar239;
            fVar78 = fStack_240 * fVar119 +
                     fVar233 * fVar169 + fStack_2c0 * fVar203 + fStack_2d0 * fVar240;
            fVar114 = fStack_23c * fVar154 +
                      fVar233 * fVar171 + fStack_2bc * fVar210 + fStack_2cc * fVar248;
            pfVar1 = (float *)(lVar24 + 0x21b2158 + lVar66 * 4);
            fVar249 = *pfVar1;
            fVar254 = pfVar1[1];
            fVar261 = pfVar1[2];
            fVar262 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21b2a60 + lVar66 * 4);
            fVar253 = *pfVar1;
            fVar293 = pfVar1[1];
            fVar295 = pfVar1[2];
            fVar298 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21b2ee4 + lVar66 * 4);
            fVar305 = *pfVar1;
            fVar307 = pfVar1[1];
            fVar308 = pfVar1[2];
            fVar204 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21b25dc + lVar66 * 4);
            fVar205 = *pfVar1;
            fVar207 = pfVar1[1];
            fVar208 = pfVar1[2];
            fVar317 = pfVar1[3];
            fVar206 = local_238 * fVar249 +
                      fVar232 * fVar205 + fVar234 * fVar253 + fVar115 * fVar305;
            fVar209 = fStack_234 * fVar254 +
                      fVar232 * fVar207 + fVar234 * fVar293 + fVar115 * fVar307;
            fVar264 = fStack_230 * fVar261 +
                      fVar232 * fVar208 + fVar234 * fVar295 + fVar115 * fVar308;
            fVar270 = fStack_22c * fVar262 +
                      fVar232 * fVar317 + fVar234 * fVar298 + fVar115 * fVar204;
            fVar272 = local_248 * fVar249 +
                      fVar233 * fVar205 + local_2c8 * fVar253 + local_2d8 * fVar305;
            fVar273 = fStack_244 * fVar254 +
                      fVar233 * fVar207 + fStack_2c4 * fVar293 + fStack_2d4 * fVar307;
            fVar309 = fStack_240 * fVar261 +
                      fVar233 * fVar208 + fStack_2c0 * fVar295 + fStack_2d0 * fVar308;
            fVar313 = fStack_23c * fVar262 +
                      fVar233 * fVar317 + fStack_2bc * fVar298 + fStack_2cc * fVar204;
            auVar291._0_8_ = CONCAT44(fVar158,fVar157) & 0x7fffffff7fffffff;
            auVar291._8_4_ = ABS(fVar192);
            auVar291._12_4_ = ABS(fVar202);
            auVar229._0_8_ = CONCAT44(fVar306,fVar299) & 0x7fffffff7fffffff;
            auVar229._8_4_ = ABS(fVar78);
            auVar229._12_4_ = ABS(fVar114);
            auVar79 = maxps(auVar291,auVar229);
            auVar303._0_8_ =
                 CONCAT44(fVar113 * fVar191 +
                          fVar159 * fStack_2b4 + fVar190 * fVar201 + fVar239 * fVar77,
                          fVar170 * fVar191 +
                          fVar156 * local_2b8 + fVar189 * fVar201 + fVar238 * fVar77) &
                 0x7fffffff7fffffff;
            auVar303._8_4_ =
                 ABS(fVar119 * fVar191 + fVar169 * fStack_2b0 + fVar203 * fVar201 + fVar240 * fVar77
                    );
            auVar303._12_4_ =
                 ABS(fVar154 * fVar191 + fVar171 * fStack_2ac + fVar210 * fVar201 + fVar248 * fVar77
                    );
            auVar79 = maxps(auVar79,auVar303);
            uVar73 = -(uint)(local_448 <= auVar79._0_4_);
            uVar72 = -(uint)(local_448 <= auVar79._4_4_);
            uVar74 = -(uint)(local_448 <= auVar79._8_4_);
            uVar75 = -(uint)(local_448 <= auVar79._12_4_);
            auVar230._0_4_ = ~uVar73 & (uint)fVar269;
            auVar230._4_4_ = ~uVar72 & (uint)fVar271;
            auVar230._8_4_ = ~uVar74 & (uint)fVar274;
            auVar230._12_4_ = ~uVar75 & (uint)fVar281;
            auVar280._0_4_ = (uint)fVar157 & uVar73;
            auVar280._4_4_ = (uint)fVar158 & uVar72;
            auVar280._8_4_ = (uint)fVar192 & uVar74;
            auVar280._12_4_ = (uint)fVar202 & uVar75;
            auVar280 = auVar280 | auVar230;
            fVar299 = (float)(~uVar73 & (uint)fVar297 | (uint)fVar299 & uVar73);
            fVar306 = (float)(~uVar72 & (uint)fVar250 | (uint)fVar306 & uVar72);
            fVar78 = (float)(~uVar74 & (uint)fVar252 | (uint)fVar78 & uVar74);
            fVar114 = (float)(~uVar75 & (uint)fVar263 | (uint)fVar114 & uVar75);
            auVar304._0_8_ = CONCAT44(fVar209,fVar206) & 0x7fffffff7fffffff;
            auVar304._8_4_ = ABS(fVar264);
            auVar304._12_4_ = ABS(fVar270);
            auVar163._0_8_ = CONCAT44(fVar273,fVar272) & 0x7fffffff7fffffff;
            auVar163._8_4_ = ABS(fVar309);
            auVar163._12_4_ = ABS(fVar313);
            auVar79 = maxps(auVar304,auVar163);
            auVar104._0_8_ =
                 CONCAT44(fVar254 * fVar191 +
                          fVar207 * fStack_2b4 + fVar293 * fVar201 + fVar307 * fVar77,
                          fVar249 * fVar191 +
                          fVar205 * local_2b8 + fVar253 * fVar201 + fVar305 * fVar77) &
                 0x7fffffff7fffffff;
            auVar104._8_4_ =
                 ABS(fVar261 * fVar191 + fVar208 * fStack_2b0 + fVar295 * fVar201 + fVar308 * fVar77
                    );
            auVar104._12_4_ =
                 ABS(fVar262 * fVar191 + fVar317 * fStack_2ac + fVar298 * fVar201 + fVar204 * fVar77
                    );
            auVar79 = maxps(auVar79,auVar104);
            uVar73 = -(uint)(local_448 <= auVar79._0_4_);
            uVar72 = -(uint)(local_448 <= auVar79._4_4_);
            uVar74 = -(uint)(local_448 <= auVar79._8_4_);
            uVar75 = -(uint)(local_448 <= auVar79._12_4_);
            fVar205 = (float)((uint)fVar206 & uVar73 | ~uVar73 & (uint)fVar269);
            fVar207 = (float)((uint)fVar209 & uVar72 | ~uVar72 & (uint)fVar271);
            fVar208 = (float)((uint)fVar264 & uVar74 | ~uVar74 & (uint)fVar274);
            fVar317 = (float)((uint)fVar270 & uVar75 | ~uVar75 & (uint)fVar281);
            fVar297 = (float)(~uVar73 & (uint)fVar297 | (uint)fVar272 & uVar73);
            fVar271 = (float)(~uVar72 & (uint)fVar250 | (uint)fVar273 & uVar72);
            fVar252 = (float)(~uVar74 & (uint)fVar252 | (uint)fVar309 & uVar74);
            fVar263 = (float)(~uVar75 & (uint)fVar263 | (uint)fVar313 & uVar75);
            fVar171 = auVar280._0_4_;
            fVar170 = auVar280._4_4_;
            fVar113 = auVar280._8_4_;
            fVar119 = auVar280._12_4_;
            auVar197._0_4_ = fVar299 * fVar299 + fVar171 * fVar171;
            auVar197._4_4_ = fVar306 * fVar306 + fVar170 * fVar170;
            auVar197._8_4_ = fVar78 * fVar78 + fVar113 * fVar113;
            auVar197._12_4_ = fVar114 * fVar114 + fVar119 * fVar119;
            auVar79 = rsqrtps(auVar230,auVar197);
            fVar154 = auVar79._0_4_;
            fVar156 = auVar79._4_4_;
            fVar159 = auVar79._8_4_;
            fVar169 = auVar79._12_4_;
            auVar231._0_4_ = fVar154 * fVar154 * auVar197._0_4_ * 0.5 * fVar154;
            auVar231._4_4_ = fVar156 * fVar156 * auVar197._4_4_ * 0.5 * fVar156;
            auVar231._8_4_ = fVar159 * fVar159 * auVar197._8_4_ * 0.5 * fVar159;
            auVar231._12_4_ = fVar169 * fVar169 * auVar197._12_4_ * 0.5 * fVar169;
            fVar238 = fVar154 * 1.5 - auVar231._0_4_;
            fVar239 = fVar156 * 1.5 - auVar231._4_4_;
            fVar240 = fVar159 * 1.5 - auVar231._8_4_;
            fVar248 = fVar169 * 1.5 - auVar231._12_4_;
            auVar198._0_4_ = fVar297 * fVar297 + fVar205 * fVar205;
            auVar198._4_4_ = fVar271 * fVar271 + fVar207 * fVar207;
            auVar198._8_4_ = fVar252 * fVar252 + fVar208 * fVar208;
            auVar198._12_4_ = fVar263 * fVar263 + fVar317 * fVar317;
            auVar79 = rsqrtps(auVar231,auVar198);
            fVar154 = auVar79._0_4_;
            fVar156 = auVar79._4_4_;
            fVar159 = auVar79._8_4_;
            fVar169 = auVar79._12_4_;
            fVar189 = fVar154 * 1.5 - fVar154 * fVar154 * auVar198._0_4_ * 0.5 * fVar154;
            fVar190 = fVar156 * 1.5 - fVar156 * fVar156 * auVar198._4_4_ * 0.5 * fVar156;
            fVar203 = fVar159 * 1.5 - fVar159 * fVar159 * auVar198._8_4_ * 0.5 * fVar159;
            fVar210 = fVar169 * 1.5 - fVar169 * fVar169 * auVar198._12_4_ * 0.5 * fVar169;
            fVar250 = fVar299 * fVar238 * auVar140._0_4_;
            fVar253 = fVar306 * fVar239 * auVar140._4_4_;
            fVar269 = fVar78 * fVar240 * auVar140._8_4_;
            fVar274 = fVar114 * fVar248 * auVar140._12_4_;
            fVar156 = -fVar171 * fVar238 * auVar140._0_4_;
            fVar159 = -fVar170 * fVar239 * auVar140._4_4_;
            fVar169 = -fVar113 * fVar240 * auVar140._8_4_;
            fVar171 = -fVar119 * fVar248 * auVar140._12_4_;
            fVar249 = fVar238 * 0.0 * auVar140._0_4_;
            fVar254 = fVar239 * 0.0 * auVar140._4_4_;
            fVar261 = fVar240 * 0.0 * auVar140._8_4_;
            fVar262 = fVar248 * 0.0 * auVar140._12_4_;
            local_2e8 = fVar116 + fVar249;
            fStack_2e4 = fVar118 + fVar254;
            fStack_2e0 = fVar120 + fVar261;
            fStack_2dc = fVar155 + fVar262;
            fVar281 = fVar297 * fVar189 * auVar311._0_4_;
            fVar293 = fVar271 * fVar190 * auVar311._4_4_;
            fVar295 = fVar252 * fVar203 * auVar311._8_4_;
            fVar298 = fVar263 * fVar210 * auVar311._12_4_;
            fVar305 = (float)local_358._0_4_ + fVar281;
            fVar307 = (float)local_358._4_4_ + fVar293;
            fVar308 = fStack_350 + fVar295;
            fVar204 = fStack_34c + fVar298;
            fVar170 = -fVar205 * fVar189 * auVar311._0_4_;
            fVar113 = -fVar207 * fVar190 * auVar311._4_4_;
            fVar119 = -fVar208 * fVar203 * auVar311._8_4_;
            fVar154 = -fVar317 * fVar210 * auVar311._12_4_;
            fVar205 = fVar282 + fVar170;
            fVar207 = fVar283 + fVar113;
            fVar208 = fVar284 + fVar119;
            fVar317 = fVar292 + fVar154;
            fVar238 = fVar189 * 0.0 * auVar311._0_4_;
            fVar239 = fVar190 * 0.0 * auVar311._4_4_;
            fVar240 = fVar203 * 0.0 * auVar311._8_4_;
            fVar248 = fVar210 * 0.0 * auVar311._12_4_;
            fVar189 = (float)local_368._0_4_ - fVar250;
            fVar190 = (float)local_368._4_4_ - fVar253;
            fVar203 = fStack_360 - fVar269;
            fVar210 = fStack_35c - fVar274;
            fVar299 = fVar319 + fVar238;
            fVar306 = fVar321 + fVar239;
            fVar78 = fVar294 + fVar240;
            fVar114 = fVar296 + fVar248;
            fVar297 = local_258 - fVar156;
            fVar252 = fStack_254 - fVar159;
            fVar263 = fStack_250 - fVar169;
            fVar271 = fStack_24c - fVar171;
            fVar116 = fVar116 - fVar249;
            fVar118 = fVar118 - fVar254;
            fVar120 = fVar120 - fVar261;
            fVar155 = fVar155 - fVar262;
            uVar73 = -(uint)(0.0 < (fVar297 * (fVar299 - fVar116) - fVar116 * (fVar205 - fVar297)) *
                                   0.0 + (fVar116 * (fVar305 - fVar189) -
                                         (fVar299 - fVar116) * fVar189) * 0.0 +
                                         ((fVar205 - fVar297) * fVar189 -
                                         (fVar305 - fVar189) * fVar297));
            uVar72 = -(uint)(0.0 < (fVar252 * (fVar306 - fVar118) - fVar118 * (fVar207 - fVar252)) *
                                   0.0 + (fVar118 * (fVar307 - fVar190) -
                                         (fVar306 - fVar118) * fVar190) * 0.0 +
                                         ((fVar207 - fVar252) * fVar190 -
                                         (fVar307 - fVar190) * fVar252));
            uVar74 = -(uint)(0.0 < (fVar263 * (fVar78 - fVar120) - fVar120 * (fVar208 - fVar263)) *
                                   0.0 + (fVar120 * (fVar308 - fVar203) -
                                         (fVar78 - fVar120) * fVar203) * 0.0 +
                                         ((fVar208 - fVar263) * fVar203 -
                                         (fVar308 - fVar203) * fVar263));
            uVar75 = -(uint)(0.0 < (fVar271 * (fVar114 - fVar155) - fVar155 * (fVar317 - fVar271)) *
                                   0.0 + (fVar155 * (fVar204 - fVar210) -
                                         (fVar114 - fVar155) * fVar210) * 0.0 +
                                         ((fVar317 - fVar271) * fVar210 -
                                         (fVar204 - fVar210) * fVar271));
            fVar281 = (float)((uint)((float)local_358._0_4_ - fVar281) & uVar73 |
                             ~uVar73 & (uint)((float)local_368._0_4_ + fVar250));
            fVar293 = (float)((uint)((float)local_358._4_4_ - fVar293) & uVar72 |
                             ~uVar72 & (uint)((float)local_368._4_4_ + fVar253));
            fVar295 = (float)((uint)(fStack_350 - fVar295) & uVar74 |
                             ~uVar74 & (uint)(fStack_360 + fVar269));
            fVar298 = (float)((uint)(fStack_34c - fVar298) & uVar75 |
                             ~uVar75 & (uint)(fStack_35c + fVar274));
            fVar157 = (float)((uint)(fVar282 - fVar170) & uVar73 |
                             ~uVar73 & (uint)(local_258 + fVar156));
            fVar158 = (float)((uint)(fVar283 - fVar113) & uVar72 |
                             ~uVar72 & (uint)(fStack_254 + fVar159));
            fVar192 = (float)((uint)(fVar284 - fVar119) & uVar74 |
                             ~uVar74 & (uint)(fStack_250 + fVar169));
            fVar202 = (float)((uint)(fVar292 - fVar154) & uVar75 |
                             ~uVar75 & (uint)(fStack_24c + fVar171));
            fVar156 = (float)((uint)(fVar319 - fVar238) & uVar73 | ~uVar73 & (uint)local_2e8);
            fVar159 = (float)((uint)(fVar321 - fVar239) & uVar72 | ~uVar72 & (uint)fStack_2e4);
            fVar169 = (float)((uint)(fVar294 - fVar240) & uVar74 | ~uVar74 & (uint)fStack_2e0);
            fVar171 = (float)((uint)(fVar296 - fVar248) & uVar75 | ~uVar75 & (uint)fStack_2dc);
            fVar249 = (float)((uint)fVar189 & uVar73 | ~uVar73 & (uint)fVar305);
            fVar254 = (float)((uint)fVar190 & uVar72 | ~uVar72 & (uint)fVar307);
            fVar261 = (float)((uint)fVar203 & uVar74 | ~uVar74 & (uint)fVar308);
            fVar262 = (float)((uint)fVar210 & uVar75 | ~uVar75 & (uint)fVar204);
            fVar250 = (float)((uint)fVar297 & uVar73 | ~uVar73 & (uint)fVar205);
            fVar253 = (float)((uint)fVar252 & uVar72 | ~uVar72 & (uint)fVar207);
            fVar269 = (float)((uint)fVar263 & uVar74 | ~uVar74 & (uint)fVar208);
            fVar274 = (float)((uint)fVar271 & uVar75 | ~uVar75 & (uint)fVar317);
            fVar238 = (float)((uint)fVar116 & uVar73 | ~uVar73 & (uint)fVar299);
            fVar239 = (float)((uint)fVar118 & uVar72 | ~uVar72 & (uint)fVar306);
            fVar240 = (float)((uint)fVar120 & uVar74 | ~uVar74 & (uint)fVar78);
            fVar248 = (float)((uint)fVar155 & uVar75 | ~uVar75 & (uint)fVar114);
            fVar282 = (float)((uint)fVar305 & uVar73 | ~uVar73 & (uint)fVar189) - fVar281;
            fVar283 = (float)((uint)fVar307 & uVar72 | ~uVar72 & (uint)fVar190) - fVar293;
            fVar284 = (float)((uint)fVar308 & uVar74 | ~uVar74 & (uint)fVar203) - fVar295;
            fVar292 = (float)((uint)fVar204 & uVar75 | ~uVar75 & (uint)fVar210) - fVar298;
            fVar297 = (float)((uint)fVar205 & uVar73 | ~uVar73 & (uint)fVar297) - fVar157;
            fVar252 = (float)((uint)fVar207 & uVar72 | ~uVar72 & (uint)fVar252) - fVar158;
            fVar263 = (float)((uint)fVar208 & uVar74 | ~uVar74 & (uint)fVar263) - fVar192;
            fVar271 = (float)((uint)fVar317 & uVar75 | ~uVar75 & (uint)fVar271) - fVar202;
            fVar305 = (float)((uint)fVar299 & uVar73 | ~uVar73 & (uint)fVar116) - fVar156;
            fVar307 = (float)((uint)fVar306 & uVar72 | ~uVar72 & (uint)fVar118) - fVar159;
            fVar308 = (float)((uint)fVar78 & uVar74 | ~uVar74 & (uint)fVar120) - fVar169;
            fVar204 = (float)((uint)fVar114 & uVar75 | ~uVar75 & (uint)fVar155) - fVar171;
            fVar319 = fVar281 - fVar249;
            fVar321 = fVar293 - fVar254;
            fVar294 = fVar295 - fVar261;
            fVar296 = fVar298 - fVar262;
            fVar170 = fVar157 - fVar250;
            fVar113 = fVar158 - fVar253;
            fVar119 = fVar192 - fVar269;
            fVar154 = fVar202 - fVar274;
            fVar189 = fVar156 - fVar238;
            fVar190 = fVar159 - fVar239;
            fVar203 = fVar169 - fVar240;
            fVar210 = fVar171 - fVar248;
            fVar205 = (fVar157 * fVar305 - fVar156 * fVar297) * 0.0 +
                      (fVar156 * fVar282 - fVar281 * fVar305) * 0.0 +
                      (fVar281 * fVar297 - fVar157 * fVar282);
            fVar207 = (fVar158 * fVar307 - fVar159 * fVar252) * 0.0 +
                      (fVar159 * fVar283 - fVar293 * fVar307) * 0.0 +
                      (fVar293 * fVar252 - fVar158 * fVar283);
            auVar184._4_4_ = fVar207;
            auVar184._0_4_ = fVar205;
            fVar208 = (fVar192 * fVar308 - fVar169 * fVar263) * 0.0 +
                      (fVar169 * fVar284 - fVar295 * fVar308) * 0.0 +
                      (fVar295 * fVar263 - fVar192 * fVar284);
            fVar317 = (fVar202 * fVar204 - fVar171 * fVar271) * 0.0 +
                      (fVar171 * fVar292 - fVar298 * fVar204) * 0.0 +
                      (fVar298 * fVar271 - fVar202 * fVar292);
            auVar312._0_4_ =
                 (fVar250 * fVar189 - fVar238 * fVar170) * 0.0 +
                 (fVar238 * fVar319 - fVar249 * fVar189) * 0.0 +
                 (fVar249 * fVar170 - fVar250 * fVar319);
            auVar312._4_4_ =
                 (fVar253 * fVar190 - fVar239 * fVar113) * 0.0 +
                 (fVar239 * fVar321 - fVar254 * fVar190) * 0.0 +
                 (fVar254 * fVar113 - fVar253 * fVar321);
            auVar312._8_4_ =
                 (fVar269 * fVar203 - fVar240 * fVar119) * 0.0 +
                 (fVar240 * fVar294 - fVar261 * fVar203) * 0.0 +
                 (fVar261 * fVar119 - fVar269 * fVar294);
            auVar312._12_4_ =
                 (fVar274 * fVar210 - fVar248 * fVar154) * 0.0 +
                 (fVar248 * fVar296 - fVar262 * fVar210) * 0.0 +
                 (fVar262 * fVar154 - fVar274 * fVar296);
            auVar184._8_4_ = fVar208;
            auVar184._12_4_ = fVar317;
            auVar79 = maxps(auVar184,auVar312);
            bVar49 = auVar79._0_4_ <= 0.0 && bVar49;
            auVar185._0_4_ = -(uint)bVar49;
            bVar50 = auVar79._4_4_ <= 0.0 && bVar50;
            auVar185._4_4_ = -(uint)bVar50;
            bVar51 = auVar79._8_4_ <= 0.0 && bVar51;
            auVar185._8_4_ = -(uint)bVar51;
            bVar52 = auVar79._12_4_ <= 0.0 && bVar52;
            auVar185._12_4_ = -(uint)bVar52;
            iVar54 = movmskps((int)(bspline_basis1 + lVar24),auVar185);
            if (iVar54 == 0) {
              auVar165._8_8_ = uStack_3b0;
              auVar165._0_8_ = local_3b8;
              iVar54 = 0;
            }
            else {
              fVar239 = fVar170 * fVar305 - fVar189 * fVar297;
              fVar240 = fVar113 * fVar307 - fVar190 * fVar252;
              fVar248 = fVar119 * fVar308 - fVar203 * fVar263;
              fVar249 = fVar154 * fVar204 - fVar210 * fVar271;
              fVar238 = fVar189 * fVar282 - fVar305 * fVar319;
              fVar190 = fVar190 * fVar283 - fVar307 * fVar321;
              fVar203 = fVar203 * fVar284 - fVar308 * fVar294;
              fVar210 = fVar210 * fVar292 - fVar204 * fVar296;
              fVar170 = fVar319 * fVar297 - fVar170 * fVar282;
              fVar254 = fVar321 * fVar252 - fVar113 * fVar283;
              fVar261 = fVar294 * fVar263 - fVar119 * fVar284;
              fVar262 = fVar296 * fVar271 - fVar154 * fVar292;
              auVar164._0_4_ = fVar238 * 0.0 + fVar170;
              auVar164._4_4_ = fVar190 * 0.0 + fVar254;
              auVar164._8_4_ = fVar203 * 0.0 + fVar261;
              auVar164._12_4_ = fVar210 * 0.0 + fVar262;
              auVar237._0_4_ = fVar239 * 0.0 + auVar164._0_4_;
              auVar237._4_4_ = fVar240 * 0.0 + auVar164._4_4_;
              auVar237._8_4_ = fVar248 * 0.0 + auVar164._8_4_;
              auVar237._12_4_ = fVar249 * 0.0 + auVar164._12_4_;
              auVar79 = rcpps(auVar164,auVar237);
              fVar113 = auVar79._0_4_;
              fVar119 = auVar79._4_4_;
              fVar154 = auVar79._8_4_;
              fVar189 = auVar79._12_4_;
              fVar113 = (1.0 - auVar237._0_4_ * fVar113) * fVar113 + fVar113;
              fVar119 = (1.0 - auVar237._4_4_ * fVar119) * fVar119 + fVar119;
              fVar154 = (1.0 - auVar237._8_4_ * fVar154) * fVar154 + fVar154;
              fVar189 = (1.0 - auVar237._12_4_ * fVar189) * fVar189 + fVar189;
              fVar156 = (fVar156 * fVar170 + fVar157 * fVar238 + fVar281 * fVar239) * fVar113;
              fVar159 = (fVar159 * fVar254 + fVar158 * fVar190 + fVar293 * fVar240) * fVar119;
              fVar169 = (fVar169 * fVar261 + fVar192 * fVar203 + fVar295 * fVar248) * fVar154;
              fVar171 = (fVar171 * fVar262 + fVar202 * fVar210 + fVar298 * fVar249) * fVar189;
              fVar170 = *(float *)(ray + k * 4 + 0x80);
              bVar49 = (fVar156 <= fVar170 && (float)local_288._0_4_ <= fVar156) && bVar49;
              auVar199._0_4_ = -(uint)bVar49;
              bVar50 = (fVar159 <= fVar170 && (float)local_288._4_4_ <= fVar159) && bVar50;
              auVar199._4_4_ = -(uint)bVar50;
              bVar51 = (fVar169 <= fVar170 && fStack_280 <= fVar169) && bVar51;
              auVar199._8_4_ = -(uint)bVar51;
              bVar52 = (fVar171 <= fVar170 && fStack_27c <= fVar171) && bVar52;
              auVar199._12_4_ = -(uint)bVar52;
              iVar54 = movmskps(iVar54,auVar199);
              if (iVar54 == 0) {
                auVar165._8_8_ = uStack_3b0;
                auVar165._0_8_ = local_3b8;
                iVar54 = 0;
              }
              else {
                auVar200._0_8_ =
                     CONCAT44(-(uint)(auVar237._4_4_ != 0.0 && bVar50),
                              -(uint)(auVar237._0_4_ != 0.0 && bVar49));
                auVar200._8_4_ = -(uint)(auVar237._8_4_ != 0.0 && bVar51);
                auVar200._12_4_ = -(uint)(auVar237._12_4_ != 0.0 && bVar52);
                iVar54 = movmskps(iVar54,auVar200);
                auVar165._8_8_ = uStack_3b0;
                auVar165._0_8_ = local_3b8;
                if (iVar54 != 0) {
                  fVar205 = fVar205 * fVar113;
                  fVar207 = fVar207 * fVar119;
                  fVar208 = fVar208 * fVar154;
                  fVar317 = fVar317 * fVar189;
                  local_308 = (float)((uint)(1.0 - fVar205) & uVar73 | ~uVar73 & (uint)fVar205);
                  fStack_304 = (float)((uint)(1.0 - fVar207) & uVar72 | ~uVar72 & (uint)fVar207);
                  fStack_300 = (float)((uint)(1.0 - fVar208) & uVar74 | ~uVar74 & (uint)fVar208);
                  fStack_2fc = (float)((uint)(1.0 - fVar317) & uVar75 | ~uVar75 & (uint)fVar317);
                  local_3c8 = (float)(~uVar73 & (uint)(auVar312._0_4_ * fVar113) |
                                     (uint)(1.0 - auVar312._0_4_ * fVar113) & uVar73);
                  fStack_3c4 = (float)(~uVar72 & (uint)(auVar312._4_4_ * fVar119) |
                                      (uint)(1.0 - auVar312._4_4_ * fVar119) & uVar72);
                  fStack_3c0 = (float)(~uVar74 & (uint)(auVar312._8_4_ * fVar154) |
                                      (uint)(1.0 - auVar312._8_4_ * fVar154) & uVar74);
                  fStack_3bc = (float)(~uVar75 & (uint)(auVar312._12_4_ * fVar189) |
                                      (uint)(1.0 - auVar312._12_4_ * fVar189) & uVar75);
                  auVar165._8_4_ = auVar200._8_4_;
                  auVar165._0_8_ = auVar200._0_8_;
                  auVar165._12_4_ = auVar200._12_4_;
                  local_318 = fVar156;
                  fStack_314 = fVar159;
                  fStack_310 = fVar169;
                  fStack_30c = fVar171;
                }
              }
            }
            iVar54 = movmskps(iVar54,auVar165);
            _local_278 = auVar247;
            if (iVar54 != 0) {
              fVar113 = (auVar311._0_4_ - auVar140._0_4_) * local_308 + auVar140._0_4_;
              fVar119 = (auVar311._4_4_ - auVar140._4_4_) * fStack_304 + auVar140._4_4_;
              fVar154 = (auVar311._8_4_ - auVar140._8_4_) * fStack_300 + auVar140._8_4_;
              fVar156 = (auVar311._12_4_ - auVar140._12_4_) * fStack_2fc + auVar140._12_4_;
              fVar170 = *(float *)((long)local_3d0->ray_space + k * 4 + -0x10);
              auVar105._0_4_ = -(uint)(fVar170 * (fVar113 + fVar113) < local_318) & auVar165._0_4_;
              auVar105._4_4_ = -(uint)(fVar170 * (fVar119 + fVar119) < fStack_314) & auVar165._4_4_;
              auVar105._8_4_ = -(uint)(fVar170 * (fVar154 + fVar154) < fStack_310) & auVar165._8_4_;
              auVar105._12_4_ =
                   -(uint)(fVar170 * (fVar156 + fVar156) < fStack_30c) & auVar165._12_4_;
              iVar54 = movmskps((int)local_3d0,auVar105);
              if (iVar54 != 0) {
                local_3c8 = local_3c8 + local_3c8 + -1.0;
                fStack_3c4 = fStack_3c4 + fStack_3c4 + -1.0;
                fStack_3c0 = fStack_3c0 + fStack_3c0 + -1.0;
                fStack_3bc = fStack_3bc + fStack_3bc + -1.0;
                local_1f8 = local_318;
                fStack_1f4 = fStack_314;
                fStack_1f0 = fStack_310;
                fStack_1ec = fStack_30c;
                local_1d8 = CONCAT44(fStack_384,local_388);
                uStack_1d0 = CONCAT44(fStack_37c,fStack_380);
                local_1c8 = CONCAT44(fStack_394,local_398);
                uStack_1c0 = CONCAT44(fStack_38c,fStack_390);
                local_1b8 = CONCAT44(fStack_3a4,local_3a8);
                uStack_1b0 = CONCAT44(fStack_39c,fStack_3a0);
                local_1a8 = CONCAT44(fStack_374,local_378);
                uStack_1a0 = CONCAT44(fStack_36c,fStack_370);
                pGVar65 = (context->scene->geometries).items[(long)pRVar64].ptr;
                pRVar62 = pRVar64;
                local_218 = local_308;
                fStack_214 = fStack_304;
                fStack_210 = fStack_300;
                fStack_20c = fStack_2fc;
                local_208 = local_3c8;
                fStack_204 = fStack_3c4;
                fStack_200 = fStack_3c0;
                fStack_1fc = fStack_3bc;
                local_1e8 = uVar70;
                local_1e4 = iVar21;
                local_198 = auVar105;
                if ((pGVar65->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar170 = (float)(int)uVar70;
                  local_188[0] = (fVar170 + local_308 + 0.0) * local_88;
                  local_188[1] = (fVar170 + fStack_304 + 1.0) * fStack_84;
                  local_188[2] = (fVar170 + fStack_300 + 2.0) * fStack_80;
                  local_188[3] = (fVar170 + fStack_2fc + 3.0) * fStack_7c;
                  local_178 = CONCAT44(fStack_3c4,local_3c8);
                  uStack_170 = CONCAT44(fStack_3bc,fStack_3c0);
                  local_168[0] = local_318;
                  local_168[1] = fStack_314;
                  local_168[2] = fStack_310;
                  local_168[3] = fStack_30c;
                  auVar141._0_4_ = auVar105._0_4_ & (uint)local_318;
                  auVar141._4_4_ = auVar105._4_4_ & (uint)fStack_314;
                  auVar141._8_4_ = auVar105._8_4_ & (uint)fStack_310;
                  auVar141._12_4_ = auVar105._12_4_ & (uint)fStack_30c;
                  auVar166._0_8_ = CONCAT44(~auVar105._4_4_,~auVar105._0_4_) & 0x7f8000007f800000;
                  auVar166._8_4_ = ~auVar105._8_4_ & 0x7f800000;
                  auVar166._12_4_ = ~auVar105._12_4_ & 0x7f800000;
                  auVar166 = auVar166 | auVar141;
                  auVar186._4_4_ = auVar166._0_4_;
                  auVar186._0_4_ = auVar166._4_4_;
                  auVar186._8_4_ = auVar166._12_4_;
                  auVar186._12_4_ = auVar166._8_4_;
                  auVar79 = minps(auVar186,auVar166);
                  auVar142._0_8_ = auVar79._8_8_;
                  auVar142._8_4_ = auVar79._0_4_;
                  auVar142._12_4_ = auVar79._4_4_;
                  auVar79 = minps(auVar142,auVar79);
                  auVar143._0_8_ =
                       CONCAT44(-(uint)(auVar79._4_4_ == auVar166._4_4_) & auVar105._4_4_,
                                -(uint)(auVar79._0_4_ == auVar166._0_4_) & auVar105._0_4_);
                  auVar143._8_4_ = -(uint)(auVar79._8_4_ == auVar166._8_4_) & auVar105._8_4_;
                  auVar143._12_4_ = -(uint)(auVar79._12_4_ == auVar166._12_4_) & auVar105._12_4_;
                  iVar54 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar143);
                  auVar106 = auVar105;
                  if (iVar54 != 0) {
                    auVar106._8_4_ = auVar143._8_4_;
                    auVar106._0_8_ = auVar143._0_8_;
                    auVar106._12_4_ = auVar143._12_4_;
                  }
                  uVar73 = movmskps(iVar54,auVar106);
                  lVar67 = 0;
                  if (uVar73 != 0) {
                    for (; (uVar73 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                    }
                  }
                  local_3f8 = auVar105;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar65->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar170 = local_188[lVar67];
                    uVar55 = *(undefined4 *)((long)&local_178 + lVar67 * 4);
                    fVar154 = 1.0 - fVar170;
                    fVar156 = fVar170 * fVar154 * 4.0;
                    fVar113 = -fVar154 * fVar154 * 0.5;
                    fVar119 = (-fVar170 * fVar170 - fVar156) * 0.5;
                    fVar154 = (fVar154 * fVar154 + fVar156) * 0.5;
                    fVar156 = fVar170 * fVar170 * 0.5;
                    *(float *)(ray + k * 4 + 0x80) = local_168[lVar67];
                    *(float *)(ray + k * 4 + 0xc0) =
                         fVar113 * local_388 +
                         fVar119 * local_398 + fVar154 * local_3a8 + fVar156 * local_378;
                    *(float *)(ray + k * 4 + 0xd0) =
                         fVar113 * fStack_384 +
                         fVar119 * fStack_394 + fVar154 * fStack_3a4 + fVar156 * fStack_374;
                    *(float *)(ray + k * 4 + 0xe0) =
                         fVar113 * fStack_380 +
                         fVar119 * fStack_390 + fVar154 * fStack_3a0 + fVar156 * fStack_370;
                    *(float *)(ray + k * 4 + 0xf0) = fVar170;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar55;
                    *(uint *)(ray + k * 4 + 0x110) = uVar71;
                    *(uint *)(ray + k * 4 + 0x120) = uVar69;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    pRVar62 = (RTCIntersectArguments *)context;
                  }
                  else {
                    auVar28 = *(undefined1 (*) [12])*local_2a8;
                    uStack_4dc = (undefined4)((ulong)*(undefined8 *)(*local_2a8 + 8) >> 0x20);
                    _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    fVar170 = local_318;
                    fVar113 = fStack_314;
                    fVar119 = fStack_310;
                    fVar154 = fStack_30c;
                    while( true ) {
                      local_e8 = local_188[lVar67];
                      local_d8 = *(undefined4 *)((long)&local_178 + lVar67 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_168[lVar67];
                      fVar171 = 1.0 - local_e8;
                      fVar156 = local_e8 * fVar171 * 4.0;
                      fVar189 = (fVar171 * fVar171 + fVar156) * 0.5;
                      fVar169 = local_e8 * local_e8 * 0.5;
                      fVar159 = (-local_e8 * local_e8 - fVar156) * 0.5;
                      local_348.context = context->user;
                      fVar156 = -fVar171 * fVar171 * 0.5;
                      local_118._0_4_ =
                           fVar156 * local_388 +
                           fVar159 * local_398 + fVar189 * local_3a8 + fVar169 * local_378;
                      local_108 = fVar156 * fStack_384 +
                                  fVar159 * fStack_394 + fVar189 * fStack_3a4 + fVar169 * fStack_374
                      ;
                      local_f8 = fVar156 * fStack_380 +
                                 fVar159 * fStack_390 + fVar189 * fStack_3a0 + fVar169 * fStack_370;
                      local_118._4_4_ = local_118._0_4_;
                      local_118._8_4_ = local_118._0_4_;
                      fStack_10c = (float)local_118._0_4_;
                      fStack_104 = local_108;
                      fStack_100 = local_108;
                      fStack_fc = local_108;
                      fStack_f4 = local_f8;
                      fStack_f0 = local_f8;
                      fStack_ec = local_f8;
                      fStack_e4 = local_e8;
                      fStack_e0 = local_e8;
                      fStack_dc = local_e8;
                      uStack_d4 = local_d8;
                      uStack_d0 = local_d8;
                      uStack_cc = local_d8;
                      local_c8 = CONCAT44(uStack_74,local_78);
                      uStack_c0 = CONCAT44(uStack_6c,uStack_70);
                      local_b8 = CONCAT44(uStack_64,local_68);
                      uStack_b0 = CONCAT44(uStack_5c,uStack_60);
                      local_a8 = (local_348.context)->instID[0];
                      uStack_a4 = local_a8;
                      uStack_a0 = local_a8;
                      uStack_9c = local_a8;
                      local_98 = (local_348.context)->instPrimID[0];
                      uStack_94 = local_98;
                      uStack_90 = local_98;
                      uStack_8c = local_98;
                      local_3e8._12_4_ = uStack_4dc;
                      local_3e8._0_12_ = auVar28;
                      local_348.valid = (int *)local_3e8;
                      pRVar62 = (RTCIntersectArguments *)pGVar65->userPtr;
                      local_348.hit = (RTCHitN *)local_118;
                      local_348.N = 4;
                      p_Var57 = pGVar65->intersectionFilterN;
                      local_348.geometryUserPtr = pRVar62;
                      local_348.ray = (RTCRayN *)ray;
                      if (p_Var57 != (RTCFilterFunctionN)0x0) {
                        p_Var57 = (RTCFilterFunctionN)(*p_Var57)(&local_348);
                        fVar170 = local_318;
                        fVar113 = fStack_314;
                        fVar119 = fStack_310;
                        fVar154 = fStack_30c;
                      }
                      auVar144._0_4_ = -(uint)(local_3e8._0_4_ == 0);
                      auVar144._4_4_ = -(uint)(local_3e8._4_4_ == 0);
                      auVar144._8_4_ = -(uint)(local_3e8._8_4_ == 0);
                      auVar144._12_4_ = -(uint)(local_3e8._12_4_ == 0);
                      uVar73 = movmskps((int)p_Var57,auVar144);
                      pRVar58 = (RayHitK<4> *)(ulong)(uVar73 ^ 0xf);
                      if ((uVar73 ^ 0xf) == 0) {
                        auVar144 = auVar144 ^ _DAT_01f7ae20;
                      }
                      else {
                        pRVar62 = context->args;
                        pRVar59 = (RTCIntersectArguments *)pRVar62->filter;
                        if ((pRVar59 != (RTCIntersectArguments *)0x0) &&
                           ((((ulong)*(Scene **)&pRVar62->flags & 2) != 0 ||
                            (((pGVar65->field_8).field_0x2 & 0x40) != 0)))) {
                          pRVar59 = (RTCIntersectArguments *)(*(code *)pRVar59)(&local_348);
                          fVar170 = local_318;
                          fVar113 = fStack_314;
                          fVar119 = fStack_310;
                          fVar154 = fStack_30c;
                        }
                        auVar107._0_4_ = -(uint)(local_3e8._0_4_ == 0);
                        auVar107._4_4_ = -(uint)(local_3e8._4_4_ == 0);
                        auVar107._8_4_ = -(uint)(local_3e8._8_4_ == 0);
                        auVar107._12_4_ = -(uint)(local_3e8._12_4_ == 0);
                        auVar144 = auVar107 ^ _DAT_01f7ae20;
                        uVar73 = movmskps((int)pRVar59,auVar107);
                        pRVar58 = (RayHitK<4> *)(ulong)(uVar73 ^ 0xf);
                        if ((uVar73 ^ 0xf) != 0) {
                          RVar26 = *(RTCFeatureFlags *)((long)local_348.hit + 4);
                          uVar73 = *(uint *)((long)local_348.hit + 8);
                          uVar70 = *(uint *)((long)((long)local_348.hit + 8) + 4);
                          *(uint *)(local_348.ray + 0xc0) =
                               ~auVar107._0_4_ & *(uint *)&(local_348.hit)->field_0x0 |
                               *(uint *)(local_348.ray + 0xc0) & auVar107._0_4_;
                          *(RTCFeatureFlags *)(local_348.ray + 0xc4) =
                               ~auVar107._4_4_ & RVar26 |
                               *(RTCFeatureFlags *)(local_348.ray + 0xc4) & auVar107._4_4_;
                          *(uint *)(local_348.ray + 200) =
                               ~auVar107._8_4_ & uVar73 |
                               *(uint *)(local_348.ray + 200) & auVar107._8_4_;
                          *(uint *)(local_348.ray + 0xcc) =
                               ~auVar107._12_4_ & uVar70 |
                               *(uint *)(local_348.ray + 0xcc) & auVar107._12_4_;
                          RVar26 = *(RTCFeatureFlags *)((long)((long)local_348.hit + 0x10) + 4);
                          uVar73 = *(uint *)((long)local_348.hit + 0x18);
                          uVar70 = *(uint *)((long)((long)local_348.hit + 0x18) + 4);
                          *(uint *)(local_348.ray + 0xd0) =
                               ~auVar107._0_4_ & *(uint *)((long)local_348.hit + 0x10) |
                               *(uint *)(local_348.ray + 0xd0) & auVar107._0_4_;
                          *(RTCFeatureFlags *)(local_348.ray + 0xd4) =
                               ~auVar107._4_4_ & RVar26 |
                               *(RTCFeatureFlags *)(local_348.ray + 0xd4) & auVar107._4_4_;
                          *(uint *)(local_348.ray + 0xd8) =
                               ~auVar107._8_4_ & uVar73 |
                               *(uint *)(local_348.ray + 0xd8) & auVar107._8_4_;
                          *(uint *)(local_348.ray + 0xdc) =
                               ~auVar107._12_4_ & uVar70 |
                               *(uint *)(local_348.ray + 0xdc) & auVar107._12_4_;
                          RVar26 = ((RTCIntersectArguments *)((long)local_348.hit + 0x20))->
                                   feature_mask;
                          uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))
                                             ->context;
                          uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_348.hit + 0x20))->context + 4);
                          *(RTCRayQueryFlags *)(local_348.ray + 0xe0) =
                               ~auVar107._0_4_ &
                               ((RTCIntersectArguments *)((long)local_348.hit + 0x20))->flags |
                               *(uint *)(local_348.ray + 0xe0) & auVar107._0_4_;
                          *(RTCFeatureFlags *)(local_348.ray + 0xe4) =
                               ~auVar107._4_4_ & RVar26 |
                               *(RTCFeatureFlags *)(local_348.ray + 0xe4) & auVar107._4_4_;
                          *(uint *)(local_348.ray + 0xe8) =
                               ~auVar107._8_4_ & uVar73 |
                               *(uint *)(local_348.ray + 0xe8) & auVar107._8_4_;
                          *(uint *)(local_348.ray + 0xec) =
                               ~auVar107._12_4_ & uVar70 |
                               *(uint *)(local_348.ray + 0xec) & auVar107._12_4_;
                          RVar26 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))
                                            ->filter + 4);
                          uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))
                                             ->intersect;
                          uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_348.hit + 0x20))->intersect + 4);
                          *(uint *)(local_348.ray + 0xf0) =
                               ~auVar107._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))->
                                         filter | *(uint *)(local_348.ray + 0xf0) & auVar107._0_4_;
                          *(RTCFeatureFlags *)(local_348.ray + 0xf4) =
                               ~auVar107._4_4_ & RVar26 |
                               *(RTCFeatureFlags *)(local_348.ray + 0xf4) & auVar107._4_4_;
                          *(uint *)(local_348.ray + 0xf8) =
                               ~auVar107._8_4_ & uVar73 |
                               *(uint *)(local_348.ray + 0xf8) & auVar107._8_4_;
                          *(uint *)(local_348.ray + 0xfc) =
                               ~auVar107._12_4_ & uVar70 |
                               *(uint *)(local_348.ray + 0xfc) & auVar107._12_4_;
                          RVar26 = ((RTCIntersectArguments *)((long)local_348.hit + 0x40))->
                                   feature_mask;
                          uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))
                                             ->context;
                          uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_348.hit + 0x40))->context + 4);
                          *(RTCRayQueryFlags *)(local_348.ray + 0x100) =
                               ~auVar107._0_4_ &
                               ((RTCIntersectArguments *)((long)local_348.hit + 0x40))->flags |
                               *(uint *)(local_348.ray + 0x100) & auVar107._0_4_;
                          *(RTCFeatureFlags *)(local_348.ray + 0x104) =
                               ~auVar107._4_4_ & RVar26 |
                               *(RTCFeatureFlags *)(local_348.ray + 0x104) & auVar107._4_4_;
                          *(uint *)(local_348.ray + 0x108) =
                               ~auVar107._8_4_ & uVar73 |
                               *(uint *)(local_348.ray + 0x108) & auVar107._8_4_;
                          *(uint *)(local_348.ray + 0x10c) =
                               ~auVar107._12_4_ & uVar70 |
                               *(uint *)(local_348.ray + 0x10c) & auVar107._12_4_;
                          RVar26 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))
                                            ->filter + 4);
                          uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))
                                             ->intersect;
                          uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_348.hit + 0x40))->intersect + 4);
                          *(uint *)(local_348.ray + 0x110) =
                               *(uint *)(local_348.ray + 0x110) & auVar107._0_4_ |
                               ~auVar107._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))->
                                         filter;
                          *(RTCFeatureFlags *)(local_348.ray + 0x114) =
                               *(RTCFeatureFlags *)(local_348.ray + 0x114) & auVar107._4_4_ |
                               ~auVar107._4_4_ & RVar26;
                          *(uint *)(local_348.ray + 0x118) =
                               *(uint *)(local_348.ray + 0x118) & auVar107._8_4_ |
                               ~auVar107._8_4_ & uVar73;
                          *(uint *)(local_348.ray + 0x11c) =
                               *(uint *)(local_348.ray + 0x11c) & auVar107._12_4_ |
                               ~auVar107._12_4_ & uVar70;
                          RVar26 = ((RTCIntersectArguments *)((long)local_348.hit + 0x60))->
                                   feature_mask;
                          uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))
                                             ->context;
                          uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_348.hit + 0x60))->context + 4);
                          *(RTCRayQueryFlags *)(local_348.ray + 0x120) =
                               *(uint *)(local_348.ray + 0x120) & auVar107._0_4_ |
                               ~auVar107._0_4_ &
                               ((RTCIntersectArguments *)((long)local_348.hit + 0x60))->flags;
                          *(RTCFeatureFlags *)(local_348.ray + 0x124) =
                               *(RTCFeatureFlags *)(local_348.ray + 0x124) & auVar107._4_4_ |
                               ~auVar107._4_4_ & RVar26;
                          *(uint *)(local_348.ray + 0x128) =
                               *(uint *)(local_348.ray + 0x128) & auVar107._8_4_ |
                               ~auVar107._8_4_ & uVar73;
                          *(uint *)(local_348.ray + 300) =
                               *(uint *)(local_348.ray + 300) & auVar107._12_4_ |
                               ~auVar107._12_4_ & uVar70;
                          RVar26 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))
                                            ->filter + 4);
                          uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))
                                             ->intersect;
                          uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_348.hit + 0x60))->intersect + 4);
                          *(uint *)(local_348.ray + 0x130) =
                               ~auVar107._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))->
                                         filter | *(uint *)(local_348.ray + 0x130) & auVar107._0_4_;
                          *(RTCFeatureFlags *)(local_348.ray + 0x134) =
                               ~auVar107._4_4_ & RVar26 |
                               *(RTCFeatureFlags *)(local_348.ray + 0x134) & auVar107._4_4_;
                          *(uint *)(local_348.ray + 0x138) =
                               ~auVar107._8_4_ & uVar73 |
                               *(uint *)(local_348.ray + 0x138) & auVar107._8_4_;
                          *(uint *)(local_348.ray + 0x13c) =
                               ~auVar107._12_4_ & uVar70 |
                               *(uint *)(local_348.ray + 0x13c) & auVar107._12_4_;
                          auVar18._0_4_ = *(undefined4 *)(local_348.hit + 0x80);
                          auVar18._4_4_ = *(undefined4 *)(local_348.hit + 0x84);
                          auVar18._8_8_ = *(undefined8 *)(local_348.hit + 0x88);
                          *(undefined1 (*) [16])(local_348.ray + 0x140) =
                               ~auVar107 & auVar18 |
                               *(undefined1 (*) [16])(local_348.ray + 0x140) & auVar107;
                          pRVar58 = (RayHitK<4> *)local_348.ray;
                          pRVar62 = (RTCIntersectArguments *)local_348.hit;
                        }
                      }
                      auVar145._0_4_ = auVar144._0_4_ << 0x1f;
                      auVar145._4_4_ = auVar144._4_4_ << 0x1f;
                      auVar145._8_4_ = auVar144._8_4_ << 0x1f;
                      auVar145._12_4_ = auVar144._12_4_ << 0x1f;
                      iVar54 = movmskps((int)pRVar58,auVar145);
                      if (iVar54 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                      }
                      else {
                        local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_518._4_4_ = 0;
                        fStack_510 = 0.0;
                        uStack_50c = 0;
                      }
                      *(undefined4 *)(local_3f8 + lVar67 * 4) = 0;
                      local_3f8._0_4_ = -(uint)(fVar170 <= (float)local_518._0_4_) & local_3f8._0_4_
                      ;
                      local_3f8._4_4_ = -(uint)(fVar113 <= (float)local_518._0_4_) & local_3f8._4_4_
                      ;
                      local_3f8._8_4_ = -(uint)(fVar119 <= (float)local_518._0_4_) & local_3f8._8_4_
                      ;
                      local_3f8._12_4_ =
                           -(uint)(fVar154 <= (float)local_518._0_4_) & local_3f8._12_4_;
                      iVar54 = movmskps(iVar54,local_3f8);
                      if (iVar54 == 0) break;
                      auVar146._0_4_ = local_3f8._0_4_ & (uint)fVar170;
                      auVar146._4_4_ = local_3f8._4_4_ & (uint)fVar113;
                      auVar146._8_4_ = local_3f8._8_4_ & (uint)fVar119;
                      auVar146._12_4_ = local_3f8._12_4_ & (uint)fVar154;
                      auVar167._0_8_ =
                           CONCAT44(~local_3f8._4_4_,~local_3f8._0_4_) & 0x7f8000007f800000;
                      auVar167._8_4_ = ~local_3f8._8_4_ & 0x7f800000;
                      auVar167._12_4_ = ~local_3f8._12_4_ & 0x7f800000;
                      auVar167 = auVar167 | auVar146;
                      auVar187._4_4_ = auVar167._0_4_;
                      auVar187._0_4_ = auVar167._4_4_;
                      auVar187._8_4_ = auVar167._12_4_;
                      auVar187._12_4_ = auVar167._8_4_;
                      auVar79 = minps(auVar187,auVar167);
                      auVar147._0_8_ = auVar79._8_8_;
                      auVar147._8_4_ = auVar79._0_4_;
                      auVar147._12_4_ = auVar79._4_4_;
                      auVar79 = minps(auVar147,auVar79);
                      auVar148._0_8_ =
                           CONCAT44(-(uint)(auVar79._4_4_ == auVar167._4_4_) & local_3f8._4_4_,
                                    -(uint)(auVar79._0_4_ == auVar167._0_4_) & local_3f8._0_4_);
                      auVar148._8_4_ = -(uint)(auVar79._8_4_ == auVar167._8_4_) & local_3f8._8_4_;
                      auVar148._12_4_ =
                           -(uint)(auVar79._12_4_ == auVar167._12_4_) & local_3f8._12_4_;
                      iVar54 = movmskps(iVar54,auVar148);
                      auVar108 = local_3f8;
                      if (iVar54 != 0) {
                        auVar108._8_4_ = auVar148._8_4_;
                        auVar108._0_8_ = auVar148._0_8_;
                        auVar108._12_4_ = auVar148._12_4_;
                      }
                      uVar55 = movmskps(iVar54,auVar108);
                      uVar60 = CONCAT44((int)((ulong)pRVar58 >> 0x20),uVar55);
                      lVar67 = 0;
                      if (uVar60 != 0) {
                        for (; (uVar60 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar61 = (int)pRVar62;
          lVar66 = lVar66 + 4;
        } while ((int)lVar66 < iVar21);
      }
      fVar170 = *(float *)(ray + k * 4 + 0x80);
      auVar139._4_4_ = -(uint)(fStack_44 <= fVar170);
      auVar139._0_4_ = -(uint)(local_48 <= fVar170);
      auVar139._8_4_ = -(uint)(fStack_40 <= fVar170);
      auVar139._12_4_ = -(uint)(fStack_3c <= fVar170);
      uVar69 = movmskps(iVar61,auVar139);
      uVar68 = uVar68 & uVar68 + 0xf & uVar69;
    } while (uVar68 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }